

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usd-export.cc
# Opt level: O3

bool tinyusdz::tydra::export_to_usda(RenderScene *scene,string *usda_str,string *warn,string *err)

{
  string *psVar1;
  pointer pBVar2;
  uint uVar3;
  uint uVar4;
  pointer pSVar5;
  _Hash_node_base *p_Var6;
  _Base_ptr p_Var7;
  size_t __n;
  optional<unsigned_int> *poVar8;
  _Alloc_hider err_00;
  size_type __val;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *this;
  undefined1 *puVar9;
  undefined8 uVar10;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *this_00;
  char cVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  long *plVar17;
  undefined8 *puVar18;
  _Rb_tree_node_base *p_Var19;
  mapped_type *this_01;
  pointer extraout_RAX;
  pointer pcVar20;
  ostream *poVar21;
  ulong uVar22;
  ulong *puVar23;
  undefined8 uVar24;
  size_t sVar25;
  ulong *puVar26;
  size_type sVar27;
  char cVar28;
  long lVar29;
  long lVar30;
  Scope *this_02;
  pointer pRVar31;
  _Rb_tree_node_base *p_Var32;
  __node_base _Var33;
  string src_animsource;
  uint32_t skel_id;
  vector<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_> bss;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> bindTransforms;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> jointNames;
  size_t num_joints;
  vector<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_> subsets;
  Prim meshPrim;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> restTransforms;
  string skel_name;
  unordered_map<unsigned_int,_tinyusdz::Skeleton,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>_>
  skelMap;
  Path animSourceTarget;
  Relationship skelRel;
  GeomMesh mesh;
  Prim skelRootPrim;
  Stage stage;
  SkelRoot skelRoot;
  undefined1 local_99e0 [8];
  undefined1 local_99d8 [24];
  RenderScene *local_99c0;
  string local_99b8;
  undefined1 local_9998 [32];
  anon_struct_8_0_00000001_for___align local_9978;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_9970;
  undefined1 *local_9968;
  _Rb_tree_node_base *local_9960;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_9958;
  storage_t<tinyusdz::value::StringData> local_9938;
  undefined8 *local_9908;
  anon_struct_8_0_00000001_for___align local_9900;
  undefined8 *local_98f8;
  undefined8 *local_98f0;
  undefined8 *local_98e8;
  undefined8 *local_98e0;
  undefined8 *local_98d8;
  undefined8 *local_98d0;
  undefined8 *local_98c8;
  undefined8 *local_98c0;
  undefined8 *local_98b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98b0;
  _Base_ptr local_98a8;
  undefined1 *local_98a0;
  undefined1 *local_9898;
  size_t local_9890;
  vector<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_> local_9888;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_9870;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_9868;
  undefined8 *local_9860;
  _Rb_tree_node_base *local_9858;
  undefined8 *local_9850;
  undefined8 *local_9848;
  undefined8 *local_9840;
  undefined8 *local_9838;
  undefined8 *local_9830;
  undefined8 *local_9828;
  undefined8 *local_9820;
  undefined8 *local_9818;
  undefined8 *local_9810;
  AttrMetas *local_9808;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_9800;
  pointer local_97f8;
  string *local_97f0;
  undefined8 *local_97e8;
  undefined1 local_97e0 [8];
  undefined1 local_97d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_97c8;
  _Alloc_hider local_97b8;
  undefined1 local_97b0 [24];
  _Alloc_hider local_9798;
  undefined1 local_9790 [24];
  _Alloc_hider local_9778;
  undefined1 local_9770 [24];
  _Alloc_hider local_9758;
  undefined1 local_9750 [24];
  _Alloc_hider local_9738;
  undefined1 local_9730 [24];
  bool local_9718;
  storage_t<tinyusdz::Path::PathType> local_9714;
  bool local_9710;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_9708;
  undefined1 local_96e8 [24];
  bool local_96d0;
  undefined8 local_96c8 [7];
  undefined8 local_9690 [8];
  bool local_9650;
  undefined8 local_9648 [5];
  undefined8 local_9620 [5];
  undefined8 local_95f8 [5];
  undefined8 local_95d0 [7];
  undefined8 local_9598 [5];
  undefined8 local_9570 [5];
  undefined8 local_9548 [5];
  _Rb_tree_node_base local_9520;
  undefined8 local_9500 [14];
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> local_9490;
  string local_9478 [3];
  ios_base local_9408 [264];
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::Skeleton>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_9300;
  undefined1 local_92c8 [8];
  undefined1 local_92c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_92b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9298;
  _Alloc_hider local_9288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9278;
  _Alloc_hider local_9268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9258;
  _Alloc_hider local_9248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9238;
  _Alloc_hider local_9228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9218 [42];
  undefined1 local_8f78 [16];
  undefined1 local_8f68 [16];
  undefined1 local_8f58 [8];
  _Alloc_hider local_8f50;
  undefined1 local_8f48 [24];
  _Alloc_hider local_8f30;
  undefined1 local_8f28 [32];
  undefined1 local_8f08 [24];
  undefined1 local_8ef0 [16];
  undefined1 local_8ee0 [24];
  undefined1 auStack_8ec8 [32];
  undefined1 local_8ea8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_8e98;
  undefined1 auStack_8e88 [8];
  undefined1 local_8e80 [32];
  undefined8 local_8e60;
  undefined1 auStack_8e58 [32];
  undefined1 auStack_8e38 [16];
  undefined1 auStack_8e28 [32];
  undefined1 local_8e08 [40];
  undefined1 auStack_8de0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_8dc8;
  undefined1 auStack_8db8 [40];
  undefined1 auStack_8d90 [56];
  undefined1 local_8d58 [40];
  undefined1 auStack_8d30 [16];
  optional<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
  local_8d20 [8];
  undefined1 auStack_8d18 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8cf8;
  undefined1 local_8ce8;
  undefined1 uStack_8ce7;
  undefined1 local_8ce0 [40];
  undefined1 local_8cb8 [24];
  undefined1 local_8ca0 [40];
  storage_t<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
  local_8c78;
  undefined1 local_8c60;
  storage_t<tinyusdz::Token> local_8c58;
  undefined1 local_8c38 [32];
  undefined1 auStack_8c18 [24];
  undefined1 auStack_8c00 [72];
  undefined1 auStack_8bb8 [40];
  undefined1 auStack_8b90 [40];
  undefined1 auStack_8b68 [40];
  undefined1 auStack_8b40 [56];
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_8b08;
  undefined8 uStack_8ae8;
  undefined1 auStack_8ae0 [24];
  undefined1 auStack_8ac8 [64];
  storage_t<tinyusdz::value::StringData> local_8a88;
  undefined1 local_8a58;
  undefined1 local_8a50 [40];
  storage_t<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> sStack_8a28;
  undefined1 local_8a10;
  storage_t<tinyusdz::Token> local_8a08;
  undefined1 local_89e8 [48];
  undefined1 local_89b8 [40];
  undefined1 local_8990 [56];
  undefined1 local_8958 [40];
  undefined1 local_8930 [40];
  undefined1 local_8908 [40];
  _Rb_tree_node_base local_88e0;
  undefined8 local_88c0;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_88b8;
  undefined8 uStack_8898;
  undefined1 auStack_8890 [24];
  undefined1 auStack_8878 [104];
  _Rb_tree_node_base local_8810;
  undefined8 local_87f0;
  undefined1 local_87e0 [72];
  undefined1 local_8798 [56];
  undefined1 local_8760 [72];
  undefined1 local_8718 [40];
  undefined1 local_86f0 [40];
  storage_t<tinyusdz::Token> local_86c8;
  undefined1 local_86a8;
  undefined1 local_86a0 [56];
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8668;
  undefined1 local_8648;
  undefined1 uStack_8647;
  undefined1 local_8640 [40];
  undefined1 local_8618 [32];
  _Rb_tree_node_base _Stack_85f8;
  storage_t<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>_>
  local_85d8;
  anon_struct_8_0_00000001_for___align local_85b8;
  undefined1 local_85b0 [16];
  undefined8 local_85a0 [2];
  undefined1 local_8590 [32];
  undefined1 auStack_8570 [16];
  undefined1 local_8560 [40];
  undefined1 auStack_8538 [16];
  undefined1 local_8528 [40];
  undefined1 auStack_8500 [32];
  undefined1 local_84e0 [24];
  undefined1 local_84c8 [32];
  undefined1 local_84a8 [40];
  undefined1 auStack_8480 [40];
  storage_t<tinyusdz::APISchemas> sStack_8458;
  undefined1 auStack_8438 [24];
  undefined1 local_8420 [40];
  undefined1 auStack_83f8 [32];
  undefined1 local_83d8 [32];
  storage_t<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>_>
  local_83b8;
  undefined1 local_8398 [40];
  undefined1 local_8370 [40];
  undefined1 local_8348 [40];
  undefined1 local_8320 [40];
  undefined1 local_82f8 [56];
  undefined1 local_82c0 [40];
  undefined1 local_8298 [40];
  undefined1 local_8270 [40];
  _Rb_tree_node_base local_8248;
  undefined8 local_8228;
  Token local_8218 [2];
  storage_t<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
  sStack_81d8;
  undefined1 local_81b8 [40];
  storage_t<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> sStack_8190;
  storage_t<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> asStack_8170 [3];
  undefined8 uStack_8128;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_8120;
  undefined8 local_80f0;
  undefined8 uStack_80e8;
  undefined8 local_80e0;
  storage_t<tinyusdz::Token> asStack_80d8 [83];
  optional<tinyusdz::APISchemas> local_7660 [20];
  undefined1 local_7340 [16];
  undefined1 local_7330 [64];
  undefined1 local_72f0 [56];
  undefined1 local_72b8 [32];
  undefined1 local_7298 [40];
  undefined1 local_7270 [40];
  undefined1 local_7248 [40];
  storage_t<tinyusdz::Token> local_7220;
  undefined1 local_7200 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_71e0 [2];
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_71c0;
  undefined1 local_71a0;
  undefined1 local_7198 [40];
  storage_t<tinyusdz::Token> local_7170;
  undefined4 local_7148 [6];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7130 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_7110 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_70f0;
  storage_t<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> sStack_70e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70c0;
  undefined2 local_70b0;
  undefined1 local_70a8 [64];
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_7068;
  undefined1 local_7038;
  undefined8 local_7030;
  undefined1 local_7028;
  storage_t<tinyusdz::Token> local_7020;
  undefined1 local_7000;
  undefined1 local_6ff8 [40];
  storage_t<tinyusdz::Token> local_6fd0;
  undefined1 local_6fb0;
  undefined1 local_6fa8 [56];
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6f70;
  undefined1 local_6f50;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6f48;
  undefined1 local_6f28;
  storage_t<tinyusdz::Token> local_6f20;
  undefined4 local_6ef8 [26];
  storage_t<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_> local_6e90;
  undefined1 local_6e50;
  undefined1 local_6e48;
  undefined4 local_6e44;
  undefined1 local_6e40;
  undefined4 local_6e3c;
  undefined2 local_6e38;
  undefined1 local_6e30;
  storage_t<tinyusdz::value::StringData> local_6e28;
  undefined1 local_6df8;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_6df0;
  undefined1 local_6dc0;
  undefined8 local_6db8;
  undefined1 local_6db0;
  storage_t<tinyusdz::Token> local_6da8;
  undefined1 local_6d88;
  storage_t<tinyusdz::Token> local_6d80;
  undefined1 local_6d60;
  storage_t<tinyusdz::Token> local_6d58;
  undefined1 local_6d38;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_6d30;
  undefined1 local_6d00;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6cf8;
  undefined1 local_6cd8;
  undefined1 local_6cd0 [80];
  undefined4 local_6c80 [2];
  undefined1 local_6c78 [160];
  storage_t<tinyusdz::value::StringData> local_6bd8;
  undefined1 local_6ba8;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_6ba0;
  undefined1 local_6b70;
  undefined8 local_6b68;
  undefined1 local_6b60;
  storage_t<tinyusdz::Token> local_6b58;
  undefined1 local_6b38;
  storage_t<tinyusdz::Token> local_6b30;
  undefined1 local_6b10;
  storage_t<tinyusdz::Token> local_6b08;
  undefined1 local_6ae8;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_6ae0;
  undefined1 local_6ab0;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6aa8;
  undefined1 local_6a88;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6a80;
  undefined1 local_6a60;
  storage_t<tinyusdz::Token> local_6a58;
  undefined4 local_6a30 [26];
  storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
  local_69c8;
  undefined1 local_6988;
  undefined1 local_6980;
  undefined4 local_697c;
  undefined1 local_6978;
  undefined4 local_6974;
  optional<bool> local_6970;
  bool local_6968 [8];
  undefined1 local_6960 [48];
  storage_t<tinyusdz::Kind> local_6930 [2];
  undefined1 local_6928 [40];
  undefined1 auStack_6900 [56];
  undefined1 auStack_68c8 [48];
  bool local_6898;
  undefined1 local_6890 [40];
  undefined1 local_6868 [56];
  undefined1 local_6830 [40];
  undefined1 local_6808 [32];
  storage_t<double> local_67e8;
  undefined1 local_67e0 [40];
  undefined1 local_67b8 [48];
  undefined1 local_6788 [40];
  undefined1 auStack_6760 [48];
  undefined1 local_6730 [40];
  undefined1 local_6708 [32];
  undefined1 local_66e8 [16];
  storage_t<tinyusdz::Token> local_66d8;
  undefined1 local_66b8;
  undefined1 local_66b0 [48];
  undefined1 local_6680 [40];
  undefined1 local_6658 [24];
  storage_t<tinyusdz::Token> local_6640;
  undefined1 local_6620;
  storage_t<tinyusdz::Token> local_6618;
  bool local_65f8;
  undefined1 local_65f0 [56];
  undefined1 local_65b8 [24];
  undefined1 auStack_65a0 [40];
  undefined1 auStack_6578 [16];
  undefined1 local_6568 [16];
  storage_t<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> local_6558;
  _Rb_tree_color local_6540 [2];
  undefined1 local_6538 [40];
  storage_t<tinyusdz::Token> local_6510;
  bool bStack_64f0;
  undefined7 local_64ef;
  undefined1 auStack_64e8 [56];
  undefined1 auStack_64b0 [40];
  undefined1 auStack_6488 [40];
  undefined1 auStack_6460 [48];
  _Base_ptr local_6430;
  undefined1 local_6428 [48];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  oStack_63f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_63d0;
  undefined1 local_63c0;
  undefined1 local_63b8 [56];
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_6380;
  bool local_6350;
  undefined1 local_6348 [48];
  undefined1 local_6318 [48];
  undefined1 auStack_62e8 [40];
  undefined1 auStack_62c0 [56];
  undefined1 auStack_6288 [40];
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6260;
  bool local_6240;
  storage_t<tinyusdz::Token> local_6238;
  bool local_6218;
  storage_t<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>_>
  local_6210;
  bool local_61f0;
  storage_t<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
  local_61e8;
  bool local_61c8;
  storage_t<std::pair<tinyusdz::ListEditQual,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_61c0;
  bool local_61a0;
  undefined1 local_6198 [56];
  undefined1 local_6160 [40];
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6138;
  bool local_6118;
  undefined1 local_6110 [40];
  undefined1 local_60e8 [8];
  _Base_ptr local_60e0;
  storage_t<tinyusdz::Token> local_60d8;
  _Rb_tree_color local_60b8 [2];
  storage_t<tinyusdz::Token> local_60b0;
  pointer pTStack_6090;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_6088;
  undefined1 local_6058 [40];
  undefined1 auStack_6030 [32];
  undefined1 local_6010 [48];
  pointer local_5fe0;
  pointer pTStack_5fd8;
  _Base_ptr local_5fd0;
  undefined1 local_5820 [4000];
  optional<tinyusdz::Relationship> local_4880 [8];
  optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>> local_2d30 [40];
  optional<tinyusdz::Relationship> local_2d08;
  Prim local_29c8;
  undefined1 local_2678 [5528];
  _Alloc_hider local_10e0;
  size_type local_10d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_10d0;
  _Alloc_hider local_10c0;
  size_type local_10b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_10b0;
  _Rb_tree_node_base local_1098;
  size_t local_1078;
  _Rb_tree_node_base local_1068;
  size_t local_1048;
  undefined2 local_1040;
  pointer local_1038;
  pointer puStack_1030;
  pointer local_1028;
  unsigned_long local_1020;
  bool local_1018;
  undefined1 local_1010 [4064];
  
  local_2678._48_8_ = local_2678 + 0x20;
  local_2678._16_8_ = (pointer)0x0;
  local_2678._0_8_ = (pointer)0x0;
  local_2678._8_8_ = (pointer)0x0;
  local_2678._32_4_ = _S_red;
  local_2678._40_8_ = (_Base_ptr)0x0;
  local_2678._64_8_ = 0;
  local_2678._72_8_ = local_2678 + 0x58;
  local_2678._80_8_ = 0;
  local_2678[0x58] = '\0';
  local_2678._104_8_ = -1;
  local_99b8._M_dataplus._M_p = (pointer)err;
  local_97f0 = usda_str;
  local_2678._56_8_ = local_2678._48_8_;
  LayerMetas::LayerMetas((LayerMetas *)(local_2678 + 0x70));
  local_10e0._M_p = (pointer)&local_10d0;
  local_10d8 = 0;
  local_10d0._M_local_buf[0] = '\0';
  local_10c0._M_p = (pointer)&local_10b0;
  local_10b8 = 0;
  local_10b0._M_local_buf[0] = '\0';
  local_1098._M_left = &local_1098;
  local_1098._M_color = _S_red;
  local_1098._M_parent = (_Base_ptr)0x0;
  local_1078 = 0;
  local_1068._M_left = &local_1068;
  local_1068._M_color = _S_red;
  local_1068._M_parent = (_Base_ptr)0x0;
  local_1048 = 0;
  local_1040._0_1_ = true;
  local_1040._1_1_ = true;
  local_1038 = (pointer)0x0;
  puStack_1030 = (pointer)0x0;
  local_1028 = (pointer)0x0;
  local_1020 = 1;
  local_1018 = true;
  local_7340._0_8_ = (pointer)local_7330;
  local_1098._M_right = local_1098._M_left;
  local_1068._M_right = local_1068._M_left;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7340,"Exported from TinyUSDZ Tydra.","");
  ::std::__cxx11::string::_M_assign((string *)(local_2678 + 0xe48));
  if ((pointer)local_7340._0_8_ != (pointer)local_7330) {
    operator_delete((void *)local_7340._0_8_,CONCAT71(local_7330._1_7_,local_7330[0]) + 1);
  }
  psVar1 = &(scene->meta).upAxis;
  iVar14 = ::std::__cxx11::string::compare((char *)psVar1);
  if (iVar14 == 0) {
    local_2678._660_4_ = (storage_t<tinyusdz::Axis>)0x0;
LAB_00318677:
    if (local_2678[0x290] == false) {
      local_2678[0x290] = true;
    }
  }
  else {
    iVar14 = ::std::__cxx11::string::compare((char *)psVar1);
    if (iVar14 == 0) {
      local_2678._660_4_ = (storage_t<tinyusdz::Axis>)0x1;
      goto LAB_00318677;
    }
    iVar14 = ::std::__cxx11::string::compare((char *)psVar1);
    if (iVar14 == 0) {
      local_2678._660_4_ = (storage_t<tinyusdz::Axis>)0x2;
      goto LAB_00318677;
    }
  }
  SkelRoot::SkelRoot((SkelRoot *)local_1010);
  local_7340._0_8_ = (pointer)local_7330;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_7340,"skelRoot","");
  ::std::__cxx11::string::_M_assign((string *)(local_1010 + 0xa0));
  if ((pointer)local_7340._0_8_ != (pointer)local_7330) {
    operator_delete((void *)local_7340._0_8_,CONCAT71(local_7330._1_7_,local_7330[0]) + 1);
  }
  Prim::Prim<tinyusdz::SkelRoot>(&local_29c8,(SkelRoot *)local_1010);
  local_9300._M_buckets = &local_9300._M_single_bucket;
  local_9300._M_bucket_count = 1;
  local_9300._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_9300._M_element_count = 0;
  local_9300._M_rehash_policy._M_max_load_factor = 1.0;
  local_9300._M_rehash_policy._M_next_resize = 0;
  local_9300._M_single_bucket = (__node_base_ptr)0x0;
  local_99c0 = scene;
  if ((scene->meshes).
      super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (scene->meshes).
      super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_9938._32_8_ = local_9750 + 8;
    local_97f8 = local_9730 + 8;
    local_9800 = &local_9708;
    local_9808 = (AttrMetas *)local_96e8;
    local_9810 = local_96c8;
    local_9818 = local_9690;
    local_9978 = (anon_struct_8_0_00000001_for___align)local_8ee0;
    local_9968 = auStack_8ec8 + 8;
    local_9970 = (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(local_8ea8 + 8);
    local_99b8.field_2._M_allocated_capacity = (size_type)local_8e80;
    local_98b8 = &local_8e60;
    local_98c0 = (undefined8 *)auStack_8e28;
    local_9820 = local_9648;
    local_98c8 = (undefined8 *)auStack_8de0;
    local_9828 = local_9620;
    local_98d0 = (undefined8 *)auStack_8db8;
    local_9830 = local_95f8;
    local_98d8 = (undefined8 *)auStack_8d90;
    local_9838 = local_95d0;
    local_98e0 = (undefined8 *)(auStack_8d90 + 0x28);
    local_9840 = local_9598;
    local_98e8 = (undefined8 *)auStack_8d30;
    local_9848 = local_9570;
    local_98f0 = (undefined8 *)(auStack_8d18 + 0x10);
    local_9850 = local_9548;
    local_98f8 = (undefined8 *)local_8ce0;
    local_9858 = &local_9520;
    local_9900 = (anon_struct_8_0_00000001_for___align)local_8cb8;
    local_9860 = local_9500;
    local_9908 = (undefined8 *)(local_8ca0 + 8);
    local_9868 = local_9218;
    local_9898 = local_9730;
    local_9870 = &local_9238;
    local_98a0 = local_9750;
    local_97e8 = (undefined8 *)auStack_8500;
    local_98b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_68c8;
    local_98a8 = (_Base_ptr)local_87e0;
    local_9938._40_8_ = 0;
    uVar22 = 0;
LAB_00318976:
    GeomMesh::GeomMesh((GeomMesh *)local_7340);
    err_00._M_p = local_99b8._M_dataplus._M_p;
    local_9888.super__Vector_base<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_9888.super__Vector_base<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_9888.super__Vector_base<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    p_Var32 = (_Rb_tree_node_base *)(uVar22 * 0x520);
    local_99b8._M_string_length = uVar22;
    bVar12 = detail::ToGeomMesh(scene,(RenderMesh *)
                                      ((long)&p_Var32->_M_color +
                                      (long)(scene->meshes).
                                            super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                                            ._M_impl.super__Vector_impl_data._M_start),
                                (GeomMesh *)local_7340,&local_9888,
                                (string *)local_99b8._M_dataplus._M_p);
    if (bVar12) {
      pRVar31 = (scene->meshes).
                super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = *(uint *)((long)&p_Var32[0x25]._M_parent + (long)pRVar31);
      uVar22 = (ulong)(int)uVar4;
      if (((long)uVar22 < 0) ||
         (pSVar5 = (scene->skeletons).
                   super__Vector_base<tinyusdz::tydra::SkelHierarchy,_std::allocator<tinyusdz::tydra::SkelHierarchy>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         uVar15 = ((long)(scene->skeletons).
                         super__Vector_base<tinyusdz::tydra::SkelHierarchy,_std::allocator<tinyusdz::tydra::SkelHierarchy>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar5 >> 3) *
                  -0x7dc11f7047dc11f7, uVar15 < uVar22 || uVar15 - uVar22 == 0)) {
        bVar12 = false;
      }
      else {
        local_9478[0]._M_dataplus._M_p = (pointer)&local_9478[0].field_2;
        local_9478[0]._M_string_length = 0;
        local_9478[0].field_2._M_allocated_capacity =
             local_9478[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_99b8.field_2._12_4_ = uVar4;
        local_9960 = p_Var32;
        if (local_9300._M_buckets[uVar22 % local_9300._M_bucket_count] != (__node_base_ptr)0x0) {
          p_Var6 = local_9300._M_buckets[uVar22 % local_9300._M_bucket_count]->_M_nxt;
          uVar3 = *(uint *)&p_Var6[1]._M_nxt;
          do {
            if (uVar4 == uVar3) {
              ::std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::Skeleton>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::Skeleton>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&local_9300,(key_type *)(local_99b8.field_2._M_local_buf + 0xc));
              ::std::__cxx11::string::_M_assign((string *)local_9478);
              goto LAB_0031a5c8;
            }
            p_Var6 = p_Var6->_M_nxt;
          } while ((p_Var6 != (_Hash_node_base *)0x0) &&
                  (uVar3 = *(uint *)&p_Var6[1]._M_nxt,
                  (ulong)uVar3 % local_9300._M_bucket_count == uVar22 % local_9300._M_bucket_count))
          ;
        }
        iVar14 = *(int *)((long)&p_Var32[0x25]._M_parent + (long)pRVar31);
        local_99e0 = (undefined1  [8])(local_99d8 + 8);
        local_99d8._0_8_ = (pointer)0x0;
        local_99d8._8_8_ = local_99d8._8_8_ & 0xffffffffffffff00;
        if (-1 < (long)pSVar5[iVar14].anim_id) {
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_8f78,"/animations/",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((scene->animations).
                            super__Vector_base<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>
                            ._M_impl.super__Vector_impl_data._M_start + pSVar5[iVar14].anim_id));
          ::std::__cxx11::string::operator=((string *)local_99e0,(string *)local_8f78);
          if ((undefined1 *)local_8f78._0_8_ != local_8f68) {
            operator_delete((void *)local_8f78._0_8_,local_8f68._0_8_ + 1);
          }
        }
        Skeleton::Skeleton((Skeleton *)local_8f78);
        local_9890 = 0;
        detail::CountNodes(&pSVar5[iVar14].root_node,&local_9890);
        sVar25 = local_9890;
        ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_9998,
                   local_9890,(allocator_type *)local_97e0);
        ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_9938,sVar25,
                   (allocator_type *)local_97e0);
        ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::vector
                  ((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                   &local_9958,sVar25,(allocator_type *)local_97e0);
        ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::vector
                  (&local_9490,sVar25,(allocator_type *)local_97e0);
        bVar12 = detail::FlattenSkelNode
                           (&pSVar5[iVar14].root_node,
                            (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_9998,
                            (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_9938
                            ,(vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                              *)&local_9958,&local_9490,(string *)err_00._M_p);
        if (bVar12) {
          nonstd::optional_lite::
          optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>::operator=
                    ((optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>> *)
                     local_98a8,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_9998);
          uVar10 = local_9938.data._0_8_;
          uVar24 = local_9998._0_8_;
          if (sVar25 != 0) {
            lVar29 = 8;
            do {
              __n = *(size_t *)((long)&(((string *)uVar24)->_M_dataplus)._M_p + lVar29);
              if ((__n != *(size_t *)(uVar10 + lVar29)) ||
                 ((__n != 0 &&
                  (iVar14 = bcmp(*(void **)(uVar24 + lVar29 + -8),*(void **)(uVar10 + -8 + lVar29),
                                 __n), iVar14 != 0)))) {
                nonstd::optional_lite::
                optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>::operator=
                          ((optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>> *
                           )(local_8a50 + 0x20),
                           (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_9938)
                ;
                break;
              }
              lVar29 = lVar29 + 0x20;
              sVar25 = sVar25 - 1;
            } while (sVar25 != 0);
          }
          nonstd::optional_lite::
          optional<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
          ::operator=((optional<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
                       *)(local_8ca0 + 0x20),
                      (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                       *)&local_9958);
          nonstd::optional_lite::
          optional<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
          ::operator=((optional<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
                       *)local_8590,&local_9490);
          if ((pointer)local_99d8._0_8_ != (pointer)0x0) {
            local_97d8._0_8_ = (pointer)0x0;
            local_97d8._8_8_ = local_97d8._8_8_ & 0xffffffffffffff00;
            local_97e0 = (undefined1  [8])(local_97d8 + 8);
            Path::Path((Path *)local_92c8,(string *)local_99e0,(string *)local_97e0);
            if (local_97e0 != (undefined1  [8])(local_97d8 + 8)) {
              operator_delete((void *)local_97e0,local_97d8._8_8_ + 1);
            }
            pcVar20 = local_97f8;
            this_00 = local_9800;
            local_97e0 = (undefined1  [8])((ulong)local_97e0 & 0xffffffff00000000);
            local_97d8._0_8_ = &aStack_97c8;
            local_97d8._8_8_ = 0;
            aStack_97c8._0_8_ = aStack_97c8._0_8_ & 0xffffffffffffff00;
            local_97b8._M_p = local_97b0 + 8;
            local_97b0._0_8_ = 0;
            local_97b0[8] = '\0';
            local_9798._M_p = local_9790 + 8;
            local_9790._0_8_ = 0;
            local_9790[8] = '\0';
            local_9778._M_p = local_9770 + 8;
            local_9770._0_8_ = 0;
            local_9770[8] = '\0';
            local_9758._M_p = (pointer)local_9938._32_8_;
            local_9750._0_8_ = 0;
            local_9750[8] = '\0';
            local_9738._M_p = local_97f8;
            local_9730._0_8_ = 0;
            local_9730[8] = '\0';
            local_9718 = false;
            local_9714 = (storage_t<tinyusdz::Path::PathType>)0x0;
            local_9710 = false;
            local_96e8[0] = false;
            local_96e8._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
            local_96e8[8] = false;
            local_96e8._12_4_ = (storage_t<unsigned_int>)0x0;
            local_96e8[0x10] = false;
            local_96e8[0x11] = (storage_t<bool>)0x0;
            local_96d0 = false;
            local_9690[7] = (storage_t<double>)0x0;
            local_9650 = false;
            local_9850[2] = 0;
            local_9850[3] = 0;
            *local_9850 = 0;
            local_9850[1] = 0;
            local_9520._M_color = _S_red;
            local_9520._M_parent = (_Base_ptr)0x0;
            *(undefined1 *)(local_9810 + 6) = 0;
            local_9810[4] = 0;
            local_9810[5] = 0;
            local_9810[2] = 0;
            local_9810[3] = 0;
            *local_9810 = 0;
            local_9810[1] = 0;
            *(undefined1 *)(local_9818 + 6) = 0;
            local_9818[4] = 0;
            local_9818[5] = 0;
            local_9818[2] = 0;
            local_9818[3] = 0;
            *local_9818 = 0;
            local_9818[1] = 0;
            *(undefined1 *)(local_9820 + 4) = 0;
            local_9820[2] = 0;
            local_9820[3] = 0;
            *local_9820 = 0;
            local_9820[1] = 0;
            *(undefined1 *)(local_9828 + 4) = 0;
            local_9828[2] = 0;
            local_9828[3] = 0;
            *local_9828 = 0;
            local_9828[1] = 0;
            *(undefined1 *)(local_9830 + 4) = 0;
            local_9830[2] = 0;
            local_9830[3] = 0;
            *local_9830 = 0;
            local_9830[1] = 0;
            *(undefined1 *)(local_9838 + 6) = 0;
            local_9838[4] = 0;
            local_9838[5] = 0;
            local_9838[2] = 0;
            local_9838[3] = 0;
            *local_9838 = 0;
            local_9838[1] = 0;
            *(undefined1 *)(local_9840 + 4) = 0;
            local_9840[2] = 0;
            local_9840[3] = 0;
            *local_9840 = 0;
            local_9840[1] = 0;
            *(undefined1 *)(local_9848 + 4) = 0;
            local_9848[2] = 0;
            local_9848[3] = 0;
            *local_9848 = 0;
            local_9848[1] = 0;
            *(undefined8 *)
             ((long)&(local_9800->
                     super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>)._M_impl.
                     super__Vector_impl_data._M_finish + 4) = 0;
            *(undefined8 *)
             ((long)&(local_9800->
                     super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>)._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4) = 0;
            (local_9800->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>).
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (local_9800->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>).
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_9520._M_left = local_9858;
            local_9520._M_right = local_9858;
            *(undefined1 *)(local_9860 + 4) = 0;
            local_9860[2] = 0;
            local_9860[3] = 0;
            *local_9860 = 0;
            local_9860[1] = 0;
            Path::operator=((Path *)local_97d8,(Path *)local_92c8);
            local_97e0._0_4_ = 1;
            nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                      ((optional<tinyusdz::Relationship> *)(local_8270 + 0x18),
                       (Relationship *)local_97e0);
            AttrMetas::~AttrMetas(local_9808);
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(this_00);
            if (local_9738._M_p != pcVar20) {
              operator_delete(local_9738._M_p,CONCAT71(local_9730._9_7_,local_9730[8]) + 1);
            }
            if (local_9758._M_p != (pointer)local_9938._32_8_) {
              operator_delete(local_9758._M_p,CONCAT71(local_9750._9_7_,local_9750[8]) + 1);
            }
            if (local_9778._M_p != local_9770 + 8) {
              operator_delete(local_9778._M_p,CONCAT71(local_9770._9_7_,local_9770[8]) + 1);
            }
            if (local_9798._M_p != local_9790 + 8) {
              operator_delete(local_9798._M_p,CONCAT71(local_9790._9_7_,local_9790[8]) + 1);
            }
            if (local_97b8._M_p != local_97b0 + 8) {
              operator_delete(local_97b8._M_p,CONCAT71(local_97b0._9_7_,local_97b0[8]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_97d8._0_8_ != &aStack_97c8) {
              operator_delete((void *)local_97d8._0_8_,aStack_97c8._0_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_9228._M_p != local_9868) {
              operator_delete(local_9228._M_p,local_9218[0]._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_9248._M_p != local_9870) {
              operator_delete(local_9248._M_p,local_9238._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_9268._M_p != &local_9258) {
              operator_delete(local_9268._M_p,local_9258._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_9288._M_p != &local_9278) {
              operator_delete(local_9288._M_p,local_9278._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)aStack_92b0._8_8_ != &local_9298) {
              operator_delete((void *)aStack_92b0._8_8_,local_9298._M_allocated_capacity + 1);
            }
            if (local_92c8 != (undefined1  [8])(local_92c0 + 8)) {
              operator_delete((void *)local_92c8,local_92c0._8_8_ + 1);
            }
          }
          ::std::__cxx11::string::_M_assign((string *)(local_8ee0 + 8));
        }
        if (local_9490.
            super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_9490.
                          super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_9490.
                                super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_9490.
                                super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_9958.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_9958.
                          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_9958.
                                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_9958.
                                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_9938);
        ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_9998);
        if (bVar12) {
          ::std::__cxx11::string::_M_assign((string *)local_9478);
          local_92c0._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_92c0._8_8_ = 0;
          aStack_92b0._0_8_ = 0;
          local_92c8._0_4_ = 4;
          local_97e0._0_4_ = 0x11;
          local_97d8._0_8_ = &aStack_97c8;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_97d8,"");
          ::std::
          vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
          ::emplace_back<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>
                    ((vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
                      *)local_92c0,
                     (pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_97e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_97d8._0_8_ != &aStack_97c8) {
            operator_delete((void *)local_97d8._0_8_,aStack_97c8._0_8_ + 1);
          }
          nonstd::optional_lite::optional<tinyusdz::APISchemas>::operator=
                    (local_7660,(APISchemas *)local_92c8);
          this_01 = ::std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::Skeleton>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::Skeleton>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&local_9300,(key_type *)(local_99b8.field_2._M_local_buf + 0xc))
          ;
          Skeleton::operator=(this_01,(Skeleton *)local_8f78);
          ::std::
          vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector((vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_92c0);
          Skeleton::~Skeleton((Skeleton *)local_8f78);
          if (local_99e0 != (undefined1  [8])(local_99d8 + 8)) {
            operator_delete((void *)local_99e0,local_99d8._8_8_ + 1);
          }
LAB_0031a5c8:
          local_8f78._0_8_ = local_8f78._0_8_ & 0xffffffff00000000;
          local_8f78._8_8_ = local_8f68 + 8;
          local_8f68._0_8_ = 0;
          local_8f68[8] = '\0';
          local_8f50._M_p = local_8f48 + 8;
          local_8f48[0] = false;
          local_8f48._1_3_ = 0;
          local_8f48._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
          local_8f48._8_8_ = local_8f48._8_8_ & 0xffffffffffffff00;
          local_8f30._M_p = local_8f28 + 8;
          local_8f28._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_8f28._8_8_ = local_8f28._8_8_ & 0xffffffffffffff00;
          local_8f28._24_8_ = local_8f08 + 8;
          local_8f08._0_8_ = 0;
          local_8f08._8_8_ = local_8f08._8_8_ & 0xffffffffffffff00;
          local_8ef0._0_8_ = local_9978;
          local_8ef0._8_8_ = 0;
          local_8ee0._0_8_ = local_8ee0._0_8_ & 0xffffffffffffff00;
          local_8ee0._16_8_ = local_9968;
          auStack_8ec8._0_8_ = 0;
          auStack_8ec8[8] = false;
          auStack_8ec8[0x18] = false;
          auStack_8ec8._28_4_ = (storage_t<tinyusdz::Path::PathType>)0x0;
          local_8ea8._0_8_ = local_8ea8._0_8_ & 0xffffffffffffff00;
          local_8e80[0] = false;
          local_8e80._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
          local_8e80[8] = false;
          local_8e80._12_4_ = (storage_t<unsigned_int>)0x0;
          local_8e80[0x10] = false;
          local_8e80[0x11] = (storage_t<bool>)0x0;
          local_8e80[0x18] = false;
          local_8e08._24_8_ = (storage_t<double>)0x0;
          local_8e08._32_8_ = local_8e08._32_8_ & 0xffffffffffffff00;
          local_98f8[2] = 0;
          local_98f8[3] = 0;
          *local_98f8 = 0;
          local_98f8[1] = 0;
          local_8cb8._0_8_ = (ulong)(uint)local_8cb8._4_4_ << 0x20;
          local_8cb8._8_8_ = (_Base_ptr)0x0;
          *(undefined1 *)(local_98b8 + 6) = 0;
          local_98b8[4] = 0;
          local_98b8[5] = 0;
          local_98b8[2] = 0;
          local_98b8[3] = 0;
          *local_98b8 = 0;
          local_98b8[1] = 0;
          *(undefined1 *)(local_98c0 + 6) = 0;
          local_98c0[4] = 0;
          local_98c0[5] = 0;
          local_98c0[2] = 0;
          local_98c0[3] = 0;
          *local_98c0 = 0;
          local_98c0[1] = 0;
          *(undefined1 *)(local_98c8 + 4) = 0;
          local_98c8[2] = 0;
          local_98c8[3] = 0;
          *local_98c8 = 0;
          local_98c8[1] = 0;
          *(undefined1 *)(local_98d0 + 4) = 0;
          local_98d0[2] = 0;
          local_98d0[3] = 0;
          *local_98d0 = 0;
          local_98d0[1] = 0;
          *(undefined1 *)(local_98d8 + 4) = 0;
          local_98d8[2] = 0;
          local_98d8[3] = 0;
          *local_98d8 = 0;
          local_98d8[1] = 0;
          *(undefined1 *)(local_98e0 + 6) = 0;
          local_98e0[4] = 0;
          local_98e0[5] = 0;
          local_98e0[2] = 0;
          local_98e0[3] = 0;
          *local_98e0 = 0;
          local_98e0[1] = 0;
          *(undefined1 *)(local_98e8 + 4) = 0;
          local_98e8[2] = 0;
          local_98e8[3] = 0;
          *local_98e8 = 0;
          local_98e8[1] = 0;
          *(undefined1 *)(local_98f0 + 4) = 0;
          local_98f0[2] = 0;
          local_98f0[3] = 0;
          *local_98f0 = 0;
          local_98f0[1] = 0;
          *(undefined8 *)
           ((long)&(local_9970->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>)
                   ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
          *(undefined8 *)
           ((long)&(local_9970->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>)
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
          (local_9970->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (local_9970->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>)._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_8cb8._16_8_ = local_9900;
          local_8ca0._0_8_ = local_9900;
          *(undefined1 *)(local_9908 + 4) = 0;
          local_9908[2] = 0;
          local_9908[3] = 0;
          *local_9908 = 0;
          local_9908[1] = 0;
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_92c8,"/skelRoot/",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_9478);
          local_99e0 = (undefined1  [8])(local_99d8 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_99e0,"");
          Path::Path((Path *)local_97e0,(string *)local_92c8,(string *)local_99e0);
          if (local_99e0 != (undefined1  [8])(local_99d8 + 8)) {
            operator_delete((void *)local_99e0,local_99d8._8_8_ + 1);
          }
          if (local_92c8 != (undefined1  [8])(local_92c0 + 8)) {
            operator_delete((void *)local_92c8,local_92c0._8_8_ + 1);
          }
          Path::operator=((Path *)(local_8f78 + 8),(Path *)local_97e0);
          local_8f78._0_4_ = 1;
          nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                    (local_4880,(Relationship *)local_8f78);
          local_99d8._0_8_ = (pointer)0x0;
          local_99d8._8_8_ = 0;
          local_99d8._16_8_ = 0;
          local_99e0._0_4_ = 4;
          local_92c8._0_4_ = 0x11;
          local_92c0._0_8_ = &aStack_92b0;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_92c0,"");
          ::std::
          vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
          ::emplace_back<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>
                    ((vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
                      *)local_99d8,
                     (pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_92c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_92c0._0_8_ != &aStack_92b0) {
            operator_delete((void *)local_92c0._0_8_,aStack_92b0._0_8_ + 1);
          }
          if (local_5820[0] == true) {
            local_92c8._0_4_ = 0x11;
            local_92c0._0_8_ = &aStack_92b0;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_92c0,"");
            ::std::
            vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
            ::emplace_back<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>
                      ((vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
                        *)(local_5820 + 0x10),
                       (pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_92c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_92c0._0_8_ != &aStack_92b0) {
              operator_delete((void *)local_92c0._0_8_,aStack_92b0._0_8_ + 1);
            }
          }
          else {
            nonstd::optional_lite::optional<tinyusdz::APISchemas>::operator=
                      ((optional<tinyusdz::APISchemas> *)local_5820,(APISchemas *)local_99e0);
          }
          ::std::
          vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector((vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_99d8);
          if ((undefined1 *)local_9750._16_8_ != local_9898) {
            operator_delete((void *)local_9750._16_8_,local_9730._0_8_ + 1);
          }
          if ((undefined1 *)local_9770._16_8_ != local_98a0) {
            operator_delete((void *)local_9770._16_8_,local_9750._0_8_ + 1);
          }
          if ((undefined1 *)local_9790._16_8_ != local_9770) {
            operator_delete((void *)local_9790._16_8_,local_9770._0_8_ + 1);
          }
          if ((undefined1 *)local_97b0._16_8_ != local_9790) {
            operator_delete((void *)local_97b0._16_8_,local_9790._0_8_ + 1);
          }
          if ((undefined1 *)aStack_97c8._8_8_ != local_97b0) {
            operator_delete((void *)aStack_97c8._8_8_,local_97b0._0_8_ + 1);
          }
          if (local_97e0 != (undefined1  [8])(local_97d8 + 8)) {
            operator_delete((void *)local_97e0,local_97d8._8_8_ + 1);
          }
          AttrMetas::~AttrMetas((AttrMetas *)local_99b8.field_2._M_allocated_capacity);
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_9970);
          if ((undefined1 *)local_8ee0._16_8_ != local_9968) {
            operator_delete((void *)local_8ee0._16_8_,
                            CONCAT71(auStack_8ec8._9_7_,auStack_8ec8[8]) + 1);
          }
          if ((anon_struct_8_0_00000001_for___align)local_8ef0._0_8_ != local_9978) {
            operator_delete((void *)local_8ef0._0_8_,local_8ee0._0_8_ + 1);
          }
          if ((undefined1 *)local_8f28._24_8_ != local_8f08 + 8) {
            operator_delete((void *)local_8f28._24_8_,local_8f08._8_8_ + 1);
          }
          if (local_8f30._M_p != local_8f28 + 8) {
            operator_delete(local_8f30._M_p,local_8f28._8_8_ + 1);
          }
          if (local_8f50._M_p != local_8f48 + 8) {
            operator_delete(local_8f50._M_p,(ulong)(local_8f48._8_8_ + 1));
          }
          pcVar20 = local_8f68 + 8;
          if ((pointer)local_8f78._8_8_ != pcVar20) {
            operator_delete((void *)local_8f78._8_8_,CONCAT71(local_8f68._9_7_,local_8f68[8]) + 1);
            pcVar20 = extraout_RAX;
          }
          bVar12 = true;
          local_9938._40_8_ = CONCAT71((int7)((ulong)pcVar20 >> 8),1);
        }
        else {
          Skeleton::~Skeleton((Skeleton *)local_8f78);
          if (local_99e0 != (undefined1  [8])(local_99d8 + 8)) {
            operator_delete((void *)local_99e0,local_99d8._8_8_ + 1);
          }
          bVar12 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9478[0]._M_dataplus._M_p != &local_9478[0].field_2) {
          operator_delete(local_9478[0]._M_dataplus._M_p,
                          local_9478[0].field_2._M_allocated_capacity + 1);
        }
        if (!bVar12) {
          bVar12 = false;
          scene = local_99c0;
          goto LAB_0031ad71;
        }
        pRVar31 = (local_99c0->meshes).
                  super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        bVar12 = true;
        p_Var32 = local_9960;
      }
      local_9998._0_8_ = (pointer)0x0;
      local_9998._8_8_ = (pointer)0x0;
      local_9998._16_8_ = (pointer)0x0;
      if (*(long *)((long)&p_Var32[0x26]._M_right + (long)pRVar31) != 0) {
        local_9938.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_9938._8_8_ = 0;
        local_9938._16_8_ = 0;
        local_9958.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_9958.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_9958.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        p_Var19 = *(_Rb_tree_node_base **)((long)&p_Var32[0x26]._M_parent + (long)pRVar31);
        local_9960 = (_Rb_tree_node_base *)((long)&p_Var32[0x25]._M_right + (long)pRVar31);
        if (p_Var19 != local_9960) {
          do {
            puVar26 = (ulong *)(local_97d8 + 8);
            local_8f78._8_8_ = (pointer)0x0;
            local_8f68._0_8_ = local_8f68._0_8_ & 0xffffffffffffff00;
            local_8f58._0_4_ = Def;
            local_8f50._M_p = (pointer)0xffffffffffffffff;
            local_8f48._0_8_ = ((ulong)local_8f48._0_8_ >> 8 & 0xffffff) << 8;
            local_8f48._8_8_ = ((ulong)local_8f48._8_8_ >> 8 & 0xffffff) << 8;
            local_8f48._16_8_ = local_8f48._16_8_ & 0xffffffffffff0000;
            local_8f30._M_p = local_8f30._M_p & 0xffffffffffffff00;
            auStack_8ec8._16_8_ = (storage_t<double>)0x0;
            auStack_8ec8[0x18] = false;
            auStack_8db8._32_8_ = 0;
            auStack_8d90._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_8db8._16_8_ = 0;
            auStack_8db8._24_8_ = 0;
            auStack_8d90._16_4_ = 0;
            auStack_8d90._24_8_ = 0;
            local_8f08[0x10] = false;
            local_8f08._0_8_ = 0;
            local_8f08._8_8_ = 0;
            local_8f28._16_8_ = 0;
            local_8f28._24_8_ = 0;
            local_8f28._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8f28._8_8_ = 0;
            auStack_8ec8[8] = false;
            local_8ee0._16_8_ = 0;
            auStack_8ec8._0_8_ = 0;
            local_8ee0._0_8_ = 0;
            local_8ee0._8_8_ = 0;
            local_8ef0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8ef0._8_8_ = 0;
            auStack_8e88[0] = false;
            aStack_8e98._M_allocated_capacity = 0;
            aStack_8e98._8_8_ = 0;
            local_8ea8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8ea8._8_8_ = 0;
            *(undefined1 *)
             &(((string *)(local_99b8.field_2._M_allocated_capacity + 0x20))->_M_dataplus)._M_p = 0;
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_99b8.field_2._M_allocated_capacity + 0x10))->_M_allocated_capacity = 0;
            *(undefined8 *)(local_99b8.field_2._M_allocated_capacity + 0x18) = 0;
            *(undefined8 *)local_99b8.field_2._M_allocated_capacity = 0;
            poVar8 = (optional<unsigned_int> *)(local_99b8.field_2._M_allocated_capacity + 8);
            poVar8->has_value_ = false;
            *(undefined3 *)&poVar8->field_0x1 = 0;
            poVar8->contained = (storage_t<unsigned_int>)0x0;
            auStack_8e38[0] = '\0';
            auStack_8e58._16_8_ = 0;
            auStack_8e58._24_8_ = 0;
            auStack_8e58._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_8e58._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8e08[8] = 0;
            auStack_8e28._24_8_ = 0;
            local_8e08._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_8e28._8_8_ = 0;
            auStack_8e28._16_8_ = 0;
            auStack_8e38._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_8e28._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_8de0[8] = 0;
            local_8e08._32_8_ = 0;
            auStack_8de0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8e08._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8e08._24_8_ = (storage_t<double>)0x0;
            auStack_8db8[8] = 0;
            aStack_8dc8._8_8_ = 0;
            auStack_8db8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_8de0._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            aStack_8dc8._M_allocated_capacity = 0;
            auStack_8d90._32_8_ = (long)auStack_8d90 + 0x10;
            local_8d58[0x18] = '\0';
            local_8d58._8_8_ = 0;
            local_8d58._16_8_ = 0;
            auStack_8d90._48_8_ = 0;
            local_8d58._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_8d30[8] = '\0';
            stack0xffffffffffff72d9 = 0;
            local_8d58._32_8_ = (pointer)0x0;
            auStack_8d30[0] = 0;
            auStack_8d30._1_7_ = 0;
            auStack_8d18[0x10] = 0;
            auStack_8d18._17_8_ = 0;
            auStack_8d18._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_8d18[8] = false;
            auStack_8d18._9_7_ = 0;
            local_8cf8._M_local_buf[0] = '\0';
            local_8cf8._M_allocated_capacity._4_4_ = 0;
            local_8cf8._M_local_buf[8] = '\0';
            local_8cf8._12_4_ = 0;
            local_8ce8 = false;
            uStack_8ce7 = (storage_t<bool>)0x0;
            local_8ce0[0] = 0;
            local_8c78._16_8_ = (storage_t<double>)0x0;
            local_8c60 = false;
            auStack_8b68._32_8_ = 0;
            auStack_8b40._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_8b68._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_8b68._24_8_ = 0;
            auStack_8b40._16_4_ = _S_red;
            auStack_8b40._24_8_ = (_Base_ptr)0x0;
            local_8cb8._16_8_ = local_8cb8._16_8_ & 0xffffffffffffff00;
            local_8cb8._0_8_ = 0;
            local_8cb8._8_8_ = (_Base_ptr)0x0;
            local_8ce0._24_8_ = 0;
            local_8ce0._32_8_ = 0;
            local_8ce0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8ce0._16_8_ = 0;
            local_8c78._8_1_ = false;
            local_8ca0._32_8_ = (pointer)0x0;
            local_8c78.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_8ca0._16_8_ = (pointer)0x0;
            local_8ca0._24_8_ = (pointer)0x0;
            local_8ca0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8ca0._8_8_ = 0;
            local_8c38[0] = false;
            local_8c58._16_8_ = 0;
            local_8c58._24_8_ = 0;
            local_8c58.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_8c58._8_8_ = 0;
            auStack_8c18[8] = false;
            local_8c38._24_8_ = 0;
            auStack_8c18._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8c38._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8c38._16_8_ = 0;
            auStack_8c00[0x18] = false;
            auStack_8c00._8_8_ = 0;
            auStack_8c00._16_8_ = 0;
            auStack_8c18._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_8c00._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_8bb8[8] = false;
            auStack_8c00._64_8_ = 0;
            auStack_8bb8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_8c00._48_8_ = 0;
            auStack_8c00._56_8_ = 0;
            auStack_8c00._32_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_8c00._40_8_ = 0;
            auStack_8b90[8] = false;
            auStack_8bb8._32_8_ = 0;
            auStack_8b90._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_8bb8._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_8bb8._24_8_ = 0;
            auStack_8b68[8] = false;
            auStack_8b90._32_8_ = 0;
            auStack_8b68._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_8b90._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_8b90._24_8_ = 0;
            auStack_8b40._32_8_ = auStack_8b40 + 0x10;
            sStack_8b08._24_1_ = false;
            sStack_8b08._8_8_ = (pointer)0x0;
            sStack_8b08._16_8_ = (pointer)0x0;
            auStack_8b40._48_8_ = 0;
            sStack_8b08.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_8ae0[8] = 0;
            auStack_8ae0._9_8_ = 0;
            uStack_8ae8 = (pointer)0x0;
            auStack_8ae0[0] = 0;
            auStack_8ae0._1_7_ = 0;
            auStack_8ac8[0x10] = 0;
            auStack_8ac8._17_8_ = 0;
            auStack_8ac8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_8ac8[8] = 0;
            auStack_8ac8._9_7_ = 0;
            auStack_8ac8[0x20] = false;
            auStack_8ac8._36_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
            auStack_8ac8[0x28] = false;
            auStack_8ac8._44_4_ = (storage_t<unsigned_int>)0x0;
            auStack_8ac8[0x30] = false;
            auStack_8ac8[0x31] = (storage_t<bool>)0x0;
            auStack_8ac8[0x38] = false;
            sStack_8a28._16_8_ = (storage_t<double>)0x0;
            local_8a10 = false;
            local_8908._16_8_ = 0;
            local_8908._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8908._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8908._8_8_ = 0;
            local_88e0._M_color = _S_red;
            local_88e0._M_parent = (_Base_ptr)0x0;
            local_8a58 = false;
            local_8a88._32_8_ = 0;
            local_8a88._40_8_ = 0;
            local_8a88._16_8_ = 0;
            local_8a88._24_8_ = 0;
            local_8a88.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_8a88._8_8_ = 0;
            sStack_8a28._8_1_ = false;
            local_8a50._32_8_ = 0;
            sStack_8a28.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_8a50._16_8_ = 0;
            local_8a50._24_8_ = 0;
            local_8a50._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8a50._8_8_ = 0;
            local_89e8[0] = false;
            local_8a08._16_8_ = 0;
            local_8a08._24_8_ = 0;
            local_8a08.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_8a08._8_8_ = 0;
            local_89e8[0x28] = false;
            local_89e8._24_8_ = 0;
            local_89e8._32_8_ = 0;
            local_89e8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_89e8._16_8_ = 0;
            local_89b8[0x20] = false;
            local_89b8._16_8_ = 0;
            local_89b8._24_8_ = 0;
            local_89b8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_89b8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8990[0x30] = false;
            local_8990._32_8_ = 0;
            local_8990._40_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8990._16_8_ = 0;
            local_8990._24_8_ = 0;
            local_8990._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8990._8_8_ = 0;
            local_8958[0x20] = false;
            local_8958._16_8_ = 0;
            local_8958._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8958._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8958._8_8_ = 0;
            local_8930[0x20] = false;
            local_8930._16_8_ = 0;
            local_8930._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8930._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8930._8_8_ = 0;
            local_88e0._M_left = &local_88e0;
            sStack_88b8._24_1_ = false;
            sStack_88b8._8_8_ = (pointer)0x0;
            sStack_88b8._16_8_ = (pointer)0x0;
            local_88c0 = 0;
            sStack_88b8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_8890[8] = 0;
            auStack_8890._9_8_ = 0;
            uStack_8898 = (pointer)0x0;
            auStack_8890[0] = 0;
            auStack_8890._1_7_ = 0;
            auStack_8878[0x10] = 0;
            auStack_8878._17_8_ = 0;
            auStack_8878._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_8878[8] = 0;
            auStack_8878._9_7_ = 0;
            auStack_8878._32_4_ = ResetToExplicit;
            auStack_8878._88_8_ = (pointer)0x0;
            auStack_8878._72_8_ = (pointer)0x0;
            auStack_8878._80_8_ = (pointer)0x0;
            local_8810._M_color = _S_red;
            local_8810._M_parent = (_Base_ptr)0x0;
            auStack_8878._56_4_ = 0;
            auStack_8878._60_8_ = 0;
            auStack_8878._40_8_ = (pointer)0x0;
            auStack_8878._48_4_ = 0;
            auStack_8878._52_4_ = 0;
            local_8810._M_left = &local_8810;
            local_87f0 = 0;
            local_87e0._0_4_ = _S_red;
            local_87e0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_87e0._16_8_ = local_98a8;
            local_87e0._24_8_ = local_98a8;
            local_87e0._48_4_ = (storage_t<tinyusdz::Kind>)0x0;
            local_87e0[0x28] = false;
            local_87e0[0x29] = (storage_t<bool>)0x0;
            local_87e0[0x2a] = false;
            local_87e0[0x2b] = (storage_t<bool>)0x0;
            local_87e0[0x2c] = false;
            local_87e0._32_5_ = 0;
            local_87e0._37_3_ = 0;
            local_87e0._56_8_ = local_8798;
            local_87e0._64_8_ = 0;
            local_8798[0] = '\0';
            local_8798[0x10] = false;
            local_8640[0] = false;
            local_84c8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_84c8._8_8_ = 0;
            local_84e0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_84e0._16_8_ = 0;
            local_84c8._24_4_ = _S_red;
            local_84a8._0_8_ = (_Base_ptr)0x0;
            local_8760[0x10] = false;
            local_8760._0_8_ = 0;
            local_8760._8_8_ = 0;
            local_8798._40_8_ = 0;
            local_8798._48_8_ = 0;
            local_8798._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8798._32_8_ = 0;
            local_8718[0] = false;
            local_8760._56_8_ = 0;
            local_8760._64_8_ = 0;
            local_8760._40_8_ = 0;
            local_8760._48_8_ = 0;
            local_8760._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8760._32_8_ = 0;
            local_86f0[0x10] = false;
            local_86f0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_86f0._8_8_ = 0;
            local_8718._24_8_ = 0;
            local_8718._32_8_ = 0;
            local_8718._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8718._16_8_ = 0;
            local_86a8 = false;
            local_86c8._16_8_ = 0;
            local_86c8._24_8_ = 0;
            local_86c8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_86c8._8_8_ = 0;
            local_86f0._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_86f0._32_8_ = 0;
            local_86a0[0x20] = false;
            local_86a0._16_8_ = 0;
            local_86a0._24_8_ = 0;
            local_86a0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_86a0._8_8_ = 0;
            local_8648 = false;
            uStack_8647 = (storage_t<bool>)0x0;
            local_8668._16_8_ = 0;
            local_8668._24_8_ = 0;
            local_8668.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_8668._8_8_ = 0;
            local_86a0._40_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_86a0._48_8_ = 0;
            local_8618[0x10] = false;
            local_8618._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8618._8_8_ = 0;
            local_8640._24_8_ = 0;
            local_8640._32_8_ = 0;
            local_8640._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8640._16_8_ = 0;
            _Stack_85f8._M_right = (_Base_ptr)((ulong)_Stack_85f8._M_right & 0xffffffffffffff00);
            _Stack_85f8._M_parent = (_Base_ptr)0x0;
            _Stack_85f8._M_left = (_Rb_tree_node_base *)0x0;
            local_8618._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            _Stack_85f8._0_8_ = 0;
            local_85b8 = (anon_struct_8_0_00000001_for___align)
                         ((ulong)local_85b8 & 0xffffffffffffff00);
            local_85d8._16_8_ = 0;
            local_85d8._24_8_ = 0;
            local_85d8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_85d8._8_8_ = 0;
            local_8590[0] = false;
            local_85a0[0] = (undefined1 *)0x0;
            local_85a0[1] = (char *)0x0;
            local_85b0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_85b0._8_8_ = 0;
            auStack_8570[8] = false;
            local_8590._24_8_ = 0;
            auStack_8570._0_8_ = 0;
            local_8590._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8590._16_8_ = (undefined1 *)0x0;
            auStack_8538[8] = false;
            local_8560._32_8_ = (undefined1 *)0x0;
            auStack_8538._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8560._16_8_ = 0;
            local_8560._24_8_ = 0;
            local_8560._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8560._8_8_ = 0;
            local_8528._32_8_ = local_8528._32_8_ & 0xffffffffffffff00;
            local_8528._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8528._24_8_ = 0;
            local_8528._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8528._8_8_ = 0;
            *(undefined1 *)(local_97e8 + 4) = 0;
            local_97e8[2] = 0;
            local_97e8[3] = 0;
            *local_97e8 = 0;
            local_97e8[1] = 0;
            local_84a8._8_8_ = local_84c8 + 0x18;
            local_84a8._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_8480._0_8_ = (ulong)(uint)auStack_8480._4_4_ << 0x20;
            auStack_8480._8_8_ = (_Base_ptr)0x0;
            auStack_8480._16_8_ = auStack_8480;
            auStack_8438[8] = 0;
            auStack_8438._9_7_ = 0;
            auStack_8438[0x10] = false;
            sStack_8458._24_8_ = (pointer)0x0;
            auStack_8438[0] = false;
            auStack_8438._1_7_ = 0;
            sStack_8458._8_8_ = (pointer)0x0;
            sStack_8458._16_8_ = (pointer)0x0;
            auStack_8480._32_8_ = 0;
            sStack_8458.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_8420._32_8_ = local_8420._32_8_ & 0xffffffffffffff00;
            local_8420._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8420._24_8_ = 0;
            local_8420._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8420._8_8_ = 0;
            auStack_83f8[0x10] = 0;
            auStack_83f8._17_7_ = 0;
            auStack_83f8[0x18] = false;
            auStack_83f8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_83f8[8] = 0;
            auStack_83f8._9_7_ = 0;
            local_8398._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_83b8._16_8_ = (pointer)0x0;
            local_83b8._24_8_ = (pointer)0x0;
            local_83b8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_83b8._8_8_ = (pointer)0x0;
            local_83d8._16_8_ = 0;
            local_83d8._24_8_ = (pointer)0x0;
            local_83d8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_83d8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_8f78._0_8_ = local_8f68;
            auStack_8d90._40_8_ = auStack_8d90._32_8_;
            auStack_8b40._40_8_ = auStack_8b40._32_8_;
            local_88e0._M_right = local_88e0._M_left;
            local_8810._M_right = local_8810._M_left;
            local_84a8._16_8_ = local_84a8._8_8_;
            auStack_8480._24_8_ = auStack_8480._16_8_;
            ::std::__cxx11::string::_M_assign((string *)local_8f78);
            if (p_Var19[4]._M_parent != (_Base_ptr)0x0) {
              nonstd::optional_lite::optional<std::__cxx11::string>::operator=
                        ((optional<std::__cxx11::string> *)local_84e0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var19 + 4));
            }
            lVar29 = (long)p_Var19[5]._M_parent - *(long *)(p_Var19 + 5);
            if (lVar29 != 0) {
              ::std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)local_97e0,lVar29 >> 2,
                         (allocator_type *)local_92c8);
              lVar29 = *(long *)(p_Var19 + 6) - (long)p_Var19[5]._M_right;
              if (lVar29 != 0) {
                lVar16 = (lVar29 >> 2) * -0x5555555555555555;
                lVar29 = *(long *)(p_Var19 + 5);
                lVar30 = 0;
                do {
                  *(undefined4 *)((long)local_97e0 + lVar30 * 4) =
                       *(undefined4 *)(lVar29 + lVar30 * 4);
                  lVar30 = lVar30 + 1;
                } while (lVar16 + (ulong)(lVar16 == 0) != lVar30);
              }
              nonstd::optional_lite::optional<std::vector<int,std::allocator<int>>>::operator=
                        ((optional<std::vector<int,std::allocator<int>>> *)(auStack_8890 + 0x10),
                         (vector<int,_std::allocator<int>_> *)local_97e0);
              if (local_97e0 != (undefined1  [8])0x0) {
                operator_delete((void *)local_97e0,local_97d8._8_8_ - (long)local_97e0);
              }
            }
            lVar29 = *(long *)(p_Var19 + 6) - (long)p_Var19[5]._M_right;
            if (lVar29 != 0) {
              ::std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::
              vector((vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                      *)local_97e0,(lVar29 >> 2) * -0x5555555555555555,(allocator_type *)local_92c8)
              ;
              p_Var7 = p_Var19[5]._M_right;
              if (*(long *)(p_Var19 + 6) - (long)p_Var7 != 0) {
                lVar29 = (*(long *)(p_Var19 + 6) - (long)p_Var7 >> 2) * -0x5555555555555555;
                lVar29 = lVar29 + (ulong)(lVar29 == 0);
                lVar16 = 8;
                do {
                  *(undefined4 *)((long)local_97e0 + lVar16 + -8) =
                       *(undefined4 *)((long)p_Var7 + lVar16 + -8);
                  *(undefined4 *)((pointer)((long)local_97e0 + -4) + lVar16) =
                       *(undefined4 *)((long)p_Var7 + lVar16 + -4);
                  *(undefined4 *)((long)local_97e0 + lVar16) =
                       *(undefined4 *)((long)&p_Var7->_M_color + lVar16);
                  lVar16 = lVar16 + 0xc;
                  lVar29 = lVar29 + -1;
                } while (lVar29 != 0);
              }
              nonstd::optional_lite::
              optional<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
              ::operator=(local_8d20,
                          (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                           *)local_97e0);
              if (local_97e0 != (undefined1  [8])0x0) {
                operator_delete((void *)local_97e0,local_97d8._8_8_ - (long)local_97e0);
              }
            }
            lVar29 = (long)p_Var19[6]._M_right - (long)p_Var19[6]._M_left;
            if (lVar29 != 0) {
              ::std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::
              vector((vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                      *)local_97e0,(lVar29 >> 2) * -0x5555555555555555,(allocator_type *)local_92c8)
              ;
              p_Var7 = p_Var19[6]._M_left;
              lVar29 = (long)p_Var19[6]._M_right - (long)p_Var7;
              if (lVar29 != 0) {
                lVar29 = (lVar29 >> 2) * -0x5555555555555555;
                lVar29 = lVar29 + (ulong)(lVar29 == 0);
                lVar16 = 8;
                do {
                  *(undefined4 *)((long)local_97e0 + lVar16 + -8) =
                       *(undefined4 *)((long)p_Var7 + lVar16 + -8);
                  *(undefined4 *)((pointer)((long)local_97e0 + -4) + lVar16) =
                       *(undefined4 *)((long)p_Var7 + lVar16 + -4);
                  *(undefined4 *)((long)local_97e0 + lVar16) =
                       *(undefined4 *)((long)&p_Var7->_M_color + lVar16);
                  lVar16 = lVar16 + 0xc;
                  lVar29 = lVar29 + -1;
                } while (lVar29 != 0);
              }
              nonstd::optional_lite::
              optional<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
              ::operator=((optional<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                           *)(auStack_8ae0 + 0x10),
                          (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                           *)local_97e0);
              if (local_97e0 != (undefined1  [8])0x0) {
                operator_delete((void *)local_97e0,local_97d8._8_8_ - (long)local_97e0);
              }
            }
            ::std::vector<tinyusdz::BlendShape,std::allocator<tinyusdz::BlendShape>>::
            emplace_back<tinyusdz::BlendShape&>
                      ((vector<tinyusdz::BlendShape,std::allocator<tinyusdz::BlendShape>> *)
                       local_9998,(BlendShape *)local_8f78);
            local_97d8._0_8_ = (pointer)0x0;
            local_97d8._8_8_ = local_97d8._8_8_ & 0xffffffffffffff00;
            local_97e0 = (undefined1  [8])puVar26;
            ::std::__cxx11::string::_M_assign((string *)local_97e0);
            ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
            emplace_back<tinyusdz::Token>
                      ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_9938,
                       (Token *)local_97e0);
            if (local_97e0 != (undefined1  [8])puVar26) {
              operator_delete((void *)local_97e0,local_97d8._8_8_ + 1);
            }
            local_92c8 = (undefined1  [8])(local_92c0 + 8);
            local_92c0._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_92c0._8_8_ = local_92c0._8_8_ & 0xffffffffffffff00;
            if (bVar12) {
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_99e0,"/skelRoot/",local_98b0);
              plVar17 = (long *)::std::__cxx11::string::append((char *)local_99e0);
              puVar23 = (ulong *)(plVar17 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar17 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar23) {
                local_9478[0].field_2._0_8_ = *puVar23;
                local_9478[0].field_2._8_8_ = plVar17[3];
                local_9478[0]._M_dataplus._M_p = (pointer)&local_9478[0].field_2;
              }
              else {
                local_9478[0].field_2._0_8_ = *puVar23;
                local_9478[0]._M_dataplus._M_p = (pointer)*plVar17;
              }
              local_9478[0]._M_string_length = plVar17[1];
              *plVar17 = (long)puVar23;
              plVar17[1] = 0;
              *(undefined1 *)(plVar17 + 2) = 0;
              plVar17 = (long *)::std::__cxx11::string::_M_append
                                          ((char *)local_9478,*(ulong *)(p_Var19 + 1));
              local_97e0 = (undefined1  [8])*plVar17;
              puVar23 = (ulong *)(plVar17 + 2);
              if (local_97e0 == (undefined1  [8])puVar23) goto LAB_0031964a;
LAB_003196a8:
              local_97d8._8_8_ = *puVar23;
            }
            else {
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_99e0,"/",local_98b0);
              puVar18 = (undefined8 *)::std::__cxx11::string::append((char *)local_99e0);
              puVar23 = puVar18 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar18 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar23) {
                local_9478[0].field_2._0_8_ = *puVar23;
                local_9478[0].field_2._8_8_ = puVar18[3];
                local_9478[0]._M_dataplus._M_p = (pointer)&local_9478[0].field_2;
              }
              else {
                local_9478[0].field_2._0_8_ = *puVar23;
                local_9478[0]._M_dataplus._M_p = (pointer)*puVar18;
              }
              local_9478[0]._M_string_length = puVar18[1];
              *puVar18 = puVar23;
              puVar18[1] = 0;
              *(undefined1 *)(puVar18 + 2) = 0;
              plVar17 = (long *)::std::__cxx11::string::_M_append
                                          ((char *)local_9478,*(ulong *)(p_Var19 + 1));
              local_97e0 = (undefined1  [8])*plVar17;
              puVar23 = (ulong *)(plVar17 + 2);
              if (local_97e0 != (undefined1  [8])puVar23) goto LAB_003196a8;
LAB_0031964a:
              local_97d8._8_8_ = *puVar23;
              aStack_97c8._M_allocated_capacity = puVar23[1];
              local_97e0 = (undefined1  [8])puVar26;
            }
            local_97d8._0_8_ = plVar17[1];
            *plVar17 = (long)puVar23;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)local_92c8,(string *)local_97e0);
            if (local_97e0 != (undefined1  [8])puVar26) {
              operator_delete((void *)local_97e0,local_97d8._8_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_9478[0]._M_dataplus._M_p != &local_9478[0].field_2) {
              operator_delete(local_9478[0]._M_dataplus._M_p,
                              local_9478[0].field_2._M_allocated_capacity + 1);
            }
            if (local_99e0 != (undefined1  [8])(local_99d8 + 8)) {
              operator_delete((void *)local_99e0,local_99d8._8_8_ + 1);
            }
            local_9478[0]._M_dataplus._M_p = (pointer)&local_9478[0].field_2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_9478,"");
            Path::Path((Path *)local_97e0,(string *)local_92c8,local_9478);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_9478[0]._M_dataplus._M_p != &local_9478[0].field_2) {
              operator_delete(local_9478[0]._M_dataplus._M_p,
                              local_9478[0].field_2._M_allocated_capacity + 1);
            }
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::push_back
                      (&local_9958,(Path *)local_97e0);
            if ((undefined1 *)local_9750._16_8_ != local_9898) {
              operator_delete((void *)local_9750._16_8_,local_9730._0_8_ + 1);
            }
            if ((undefined1 *)local_9770._16_8_ != local_98a0) {
              operator_delete((void *)local_9770._16_8_,local_9750._0_8_ + 1);
            }
            if ((undefined1 *)local_9790._16_8_ != local_9770) {
              operator_delete((void *)local_9790._16_8_,local_9770._0_8_ + 1);
            }
            if ((undefined1 *)local_97b0._16_8_ != local_9790) {
              operator_delete((void *)local_97b0._16_8_,local_9790._0_8_ + 1);
            }
            if ((undefined1 *)aStack_97c8._8_8_ != local_97b0) {
              operator_delete((void *)aStack_97c8._8_8_,local_97b0._0_8_ + 1);
            }
            if (local_97e0 != (undefined1  [8])(local_97d8 + 8)) {
              operator_delete((void *)local_97e0,local_97d8._8_8_ + 1);
            }
            if (local_92c8 != (undefined1  [8])(local_92c0 + 8)) {
              operator_delete((void *)local_92c8,local_92c0._8_8_ + 1);
            }
            BlendShape::~BlendShape((BlendShape *)local_8f78);
            p_Var19 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var19);
          } while (p_Var19 != local_9960);
        }
        puVar9 = local_9968;
        this = local_9970;
        local_8f78._0_8_ = local_8f78._0_8_ & 0xffffffff00000000;
        local_8f78._8_8_ = local_8f68 + 8;
        local_8f68._0_8_ = 0;
        local_8f68[8] = '\0';
        local_8f50._M_p = local_8f48 + 8;
        local_8f48[0] = false;
        local_8f48._1_3_ = 0;
        local_8f48._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
        local_8f48._8_8_ = local_8f48._8_8_ & 0xffffffffffffff00;
        local_8f30._M_p = local_8f28 + 8;
        local_8f28._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_8f28._8_8_ = local_8f28._8_8_ & 0xffffffffffffff00;
        local_8f28._24_8_ = local_8f08 + 8;
        local_8f08._0_8_ = 0;
        local_8f08._8_8_ = local_8f08._8_8_ & 0xffffffffffffff00;
        local_8ef0._0_8_ = local_9978;
        local_8ef0._8_8_ = 0;
        local_8ee0._0_8_ = local_8ee0._0_8_ & 0xffffffffffffff00;
        local_8ee0._16_8_ = local_9968;
        auStack_8ec8._0_8_ = 0;
        auStack_8ec8[8] = false;
        auStack_8ec8[0x18] = false;
        auStack_8ec8._28_4_ = (storage_t<tinyusdz::Path::PathType>)0x0;
        local_8ea8._0_8_ = local_8ea8._0_8_ & 0xffffffffffffff00;
        local_8e80[0] = false;
        local_8e80._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
        local_8e80[8] = false;
        local_8e80._12_4_ = (storage_t<unsigned_int>)0x0;
        local_8e80[0x10] = false;
        local_8e80[0x11] = (storage_t<bool>)0x0;
        local_8e80[0x18] = false;
        local_8e08._24_8_ = (storage_t<double>)0x0;
        local_8e08._32_8_ = local_8e08._32_8_ & 0xffffffffffffff00;
        local_98f8[2] = 0;
        local_98f8[3] = 0;
        *local_98f8 = 0;
        local_98f8[1] = 0;
        local_8cb8._0_8_ = (ulong)(uint)local_8cb8._4_4_ << 0x20;
        local_8cb8._8_8_ = (_Base_ptr)0x0;
        *(undefined1 *)(local_98b8 + 6) = 0;
        local_98b8[4] = 0;
        local_98b8[5] = 0;
        local_98b8[2] = 0;
        local_98b8[3] = 0;
        *local_98b8 = 0;
        local_98b8[1] = 0;
        *(undefined1 *)(local_98c0 + 6) = 0;
        local_98c0[4] = 0;
        local_98c0[5] = 0;
        local_98c0[2] = 0;
        local_98c0[3] = 0;
        *local_98c0 = 0;
        local_98c0[1] = 0;
        *(undefined1 *)(local_98c8 + 4) = 0;
        local_98c8[2] = 0;
        local_98c8[3] = 0;
        *local_98c8 = 0;
        local_98c8[1] = 0;
        *(undefined1 *)(local_98d0 + 4) = 0;
        local_98d0[2] = 0;
        local_98d0[3] = 0;
        *local_98d0 = 0;
        local_98d0[1] = 0;
        *(undefined1 *)(local_98d8 + 4) = 0;
        local_98d8[2] = 0;
        local_98d8[3] = 0;
        *local_98d8 = 0;
        local_98d8[1] = 0;
        *(undefined1 *)(local_98e0 + 6) = 0;
        local_98e0[4] = 0;
        local_98e0[5] = 0;
        local_98e0[2] = 0;
        local_98e0[3] = 0;
        *local_98e0 = 0;
        local_98e0[1] = 0;
        *(undefined1 *)(local_98e8 + 4) = 0;
        local_98e8[2] = 0;
        local_98e8[3] = 0;
        *local_98e8 = 0;
        local_98e8[1] = 0;
        *(undefined1 *)(local_98f0 + 4) = 0;
        local_98f0[2] = 0;
        local_98f0[3] = 0;
        *local_98f0 = 0;
        local_98f0[1] = 0;
        *(undefined8 *)
         ((long)&(local_9970->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>).
                 _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
        *(undefined8 *)
         ((long)&(local_9970->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>).
                 _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
        (local_9970->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_9970->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_8cb8._16_8_ = local_9900;
        local_8ca0._0_8_ = local_9900;
        *(undefined1 *)(local_9908 + 4) = 0;
        local_9908[2] = 0;
        local_9908[3] = 0;
        *local_9908 = 0;
        local_9908[1] = 0;
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  (local_9970,(vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_9958
                  );
        local_8f78._0_4_ = 2;
        nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                  (&local_2d08,(Relationship *)local_8f78);
        nonstd::optional_lite::
        optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>::operator=
                  (local_2d30,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_9938);
        AttrMetas::~AttrMetas((AttrMetas *)local_99b8.field_2._M_allocated_capacity);
        ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                  ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)this);
        if ((undefined1 *)local_8ee0._16_8_ != puVar9) {
          operator_delete((void *)local_8ee0._16_8_,CONCAT71(auStack_8ec8._9_7_,auStack_8ec8[8]) + 1
                         );
        }
        if ((anon_struct_8_0_00000001_for___align)local_8ef0._0_8_ != local_9978) {
          operator_delete((void *)local_8ef0._0_8_,local_8ee0._0_8_ + 1);
        }
        if ((undefined1 *)local_8f28._24_8_ != local_8f08 + 8) {
          operator_delete((void *)local_8f28._24_8_,local_8f08._8_8_ + 1);
        }
        if (local_8f30._M_p != local_8f28 + 8) {
          operator_delete(local_8f30._M_p,local_8f28._8_8_ + 1);
        }
        if (local_8f50._M_p != local_8f48 + 8) {
          operator_delete(local_8f50._M_p,(ulong)(local_8f48._8_8_ + 1));
        }
        if ((undefined1 *)local_8f78._8_8_ != local_8f68 + 8) {
          operator_delete((void *)local_8f78._8_8_,CONCAT71(local_8f68._9_7_,local_8f68[8]) + 1);
        }
        ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&local_9958);
        ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_9938);
      }
      Prim::Prim<tinyusdz::GeomMesh>((Prim *)local_97e0,(GeomMesh *)local_7340);
      if (local_9998._8_8_ != local_9998._0_8_) {
        lVar29 = 0;
        uVar22 = 0;
        do {
          Prim::Prim<tinyusdz::BlendShape>
                    ((Prim *)local_8f78,
                     (BlendShape *)
                     ((long)&(((string *)local_9998._0_8_)->_M_dataplus)._M_p + lVar29));
          bVar13 = Prim::add_child((Prim *)local_97e0,(Prim *)local_8f78,false,
                                   (string *)local_99b8._M_dataplus._M_p);
          Prim::~Prim((Prim *)local_8f78);
          if (!bVar13) goto LAB_00319d63;
          uVar22 = uVar22 + 1;
          lVar29 = lVar29 + 0xbe8;
        } while (uVar22 < (ulong)(((long)(local_9998._8_8_ - local_9998._0_8_) >> 3) *
                                 -0x2b00ac02b00ac02b));
      }
      if (local_9888.super__Vector_base<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_9888.super__Vector_base<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar29 = 0;
        uVar22 = 0;
        do {
          Prim::Prim<tinyusdz::GeomSubset>
                    ((Prim *)local_8f78,
                     (GeomSubset *)
                     ((long)&((local_9888.
                               super__Vector_base<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>
                               ._M_impl.super__Vector_impl_data._M_start)->super_MaterialBinding).
                             materialBinding.has_value_ + lVar29));
          bVar13 = Prim::add_child((Prim *)local_97e0,(Prim *)local_8f78,false,
                                   (string *)local_99b8._M_dataplus._M_p);
          Prim::~Prim((Prim *)local_8f78);
          if (!bVar13) goto LAB_00319d63;
          uVar22 = uVar22 + 1;
          lVar29 = lVar29 + 0x1568;
        } while (uVar22 < (ulong)(((long)local_9888.
                                         super__Vector_base<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_9888.
                                         super__Vector_base<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5fac493fe814edb));
      }
      if (bVar12) {
        Prim::add_child(&local_29c8,(Prim *)local_97e0,false,(string *)0x0);
        bVar12 = true;
      }
      else {
        Scope::Scope((Scope *)local_8f78);
        __val = local_99b8._M_string_length;
        cVar28 = '\x01';
        if (9 < local_99b8._M_string_length) {
          sVar27 = local_99b8._M_string_length;
          cVar11 = '\x04';
          do {
            cVar28 = cVar11;
            if (sVar27 < 100) {
              cVar28 = cVar28 + -2;
              goto LAB_0031ac0f;
            }
            if (sVar27 < 1000) {
              cVar28 = cVar28 + -1;
              goto LAB_0031ac0f;
            }
            if (sVar27 < 10000) goto LAB_0031ac0f;
            bVar12 = 99999 < sVar27;
            sVar27 = sVar27 / 10000;
            cVar11 = cVar28 + '\x04';
          } while (bVar12);
          cVar28 = cVar28 + '\x01';
        }
LAB_0031ac0f:
        local_9478[0]._M_dataplus._M_p = (pointer)&local_9478[0].field_2;
        ::std::__cxx11::string::_M_construct((ulong)local_9478,cVar28);
        ::std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_9478[0]._M_dataplus._M_p,(uint)local_9478[0]._M_string_length,__val);
        plVar17 = (long *)::std::__cxx11::string::replace((ulong)local_9478,0,(char *)0x0,0x5e0257);
        puVar26 = (ulong *)(plVar17 + 2);
        if ((ulong *)*plVar17 == puVar26) {
          local_92c0._8_8_ = *puVar26;
          aStack_92b0._M_allocated_capacity = plVar17[3];
          local_92c8 = (undefined1  [8])(local_92c0 + 8);
        }
        else {
          local_92c0._8_8_ = *puVar26;
          local_92c8 = (undefined1  [8])*plVar17;
        }
        local_92c0._0_8_ = plVar17[1];
        *plVar17 = (long)puVar26;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        ::std::__cxx11::string::operator=((string *)local_85a0,(string *)local_92c8);
        if (local_92c8 != (undefined1  [8])(local_92c0 + 8)) {
          operator_delete((void *)local_92c8,local_92c0._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9478[0]._M_dataplus._M_p != &local_9478[0].field_2) {
          operator_delete(local_9478[0]._M_dataplus._M_p,
                          local_9478[0].field_2._M_allocated_capacity + 1);
        }
        Prim::Prim<tinyusdz::Scope>((Prim *)local_92c8,(Scope *)local_8f78);
        Prim::add_child((Prim *)local_92c8,(Prim *)local_97e0,true,(string *)0x0);
        Stage::add_root_prim((Stage *)local_2678,(Prim *)local_92c8,true);
        Prim::~Prim((Prim *)local_92c8);
        Scope::~Scope((Scope *)local_8f78);
        bVar12 = true;
      }
      goto LAB_0031ad5f;
    }
    bVar12 = false;
    goto LAB_0031ad71;
  }
LAB_0031ae2c:
  Scope::Scope((Scope *)local_8f78);
  ::std::__cxx11::string::_M_replace((ulong)local_85a0,0,(char *)local_85a0[1],0x5e025d);
  Prim::Prim<tinyusdz::Scope>((Prim *)local_97e0,(Scope *)local_8f78);
  if ((scene->animations).
      super__Vector_base<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (scene->animations).
      super__Vector_base<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar29 = 0;
    uVar22 = 0;
    do {
      local_7340._0_8_ = local_7330;
      local_7340._8_8_ = (pointer)0x0;
      local_7330[0] = '\0';
      local_7330._16_4_ = _S_red;
      local_7330._24_8_ = -NAN;
      local_7330[0x20] = '\0';
      local_7330._36_4_ = 0;
      local_7330[0x28] = '\0';
      local_7330._44_4_ = 0;
      local_7330._48_2_ = 0;
      local_7330[0x38] = false;
      local_7298._24_8_ = 0;
      local_7298[0x20] = 0;
      local_7170._16_8_ = 0;
      local_7170._24_8_ = 0;
      local_7170.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_7170._8_8_ = 0;
      local_7148[0] = 0;
      local_7148[2] = 0;
      local_7148[3] = 0;
      local_72f0[0x30] = false;
      local_72f0._32_8_ = 0.0;
      local_72f0._40_8_ = 0.0;
      local_72f0._16_8_ = (pointer)0x0;
      local_72f0._24_8_ = (pointer)0x0;
      local_72f0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_72f0._8_8_ = 0.0;
      local_7298[0x10] = '\0';
      local_7298._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_7298._8_8_ = 0;
      local_72b8._16_8_ = 0.0;
      local_72b8._24_8_ = (pointer)0x0;
      local_72b8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_72b8._8_8_ = 0.0;
      local_7270[0x20] = 0;
      local_7270._16_8_ = 0;
      local_7270._24_8_ = 0;
      local_7270._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_7270._8_8_ = 0;
      local_7248[0x20] = 0;
      local_7248._16_8_ = 0;
      local_7248._24_8_ = 0;
      local_7248._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_7248._8_8_ = 0;
      local_7200[0] = '\0';
      local_7220._16_8_ = 0;
      local_7220._24_8_ = 0;
      local_7220.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_7220._8_8_ = 0;
      aaStack_71e0[1]._8_1_ = 0;
      aaStack_71e0[0]._8_8_ = 0;
      aaStack_71e0[1]._0_8_ = 0;
      local_7200._24_8_ = 0;
      aaStack_71e0[0]._M_allocated_capacity = 0;
      local_7200._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_7200._16_8_ = 0;
      local_71a0 = 0;
      local_71c0._16_8_ = 0;
      local_71c0._24_8_ = 0;
      local_71c0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_71c0._8_8_ = 0;
      local_7198[0x20] = 0;
      local_7198._16_8_ = 0;
      local_7198._24_8_ = 0;
      local_7198._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_7198._8_8_ = 0;
      local_7148._16_8_ = local_7148;
      aaStack_7110[0]._M_local_buf[8] = '\0';
      local_7130[1]._8_8_ = 0;
      aaStack_7110[0]._M_allocated_capacity = 0;
      local_7130[0]._8_8_ = 0;
      local_7130[1]._0_8_ = 0;
      aStack_70f0._M_local_buf[0] = '\0';
      aStack_70f0._1_8_ = 0;
      aaStack_7110[1]._0_8_ = 0;
      aaStack_7110[1]._8_1_ = 0;
      aaStack_7110[1]._9_7_ = 0;
      sStack_70e0._16_1_ = 0;
      stack0xffffffffffff8f31 = 0;
      sStack_70e0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      sStack_70e0._8_1_ = 0;
      sStack_70e0._9_7_ = 0;
      local_70c0._M_local_buf[0] = '\0';
      local_70c0._M_allocated_capacity._4_4_ = 0;
      local_70c0._M_local_buf[8] = '\0';
      local_70c0._12_4_ = 0;
      local_70b0 = 0;
      local_70a8[0] = 0;
      local_7030 = 0;
      local_7028 = 0;
      local_6f20._16_8_ = 0;
      local_6f20._24_8_ = 0;
      local_6f20.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6f20._8_8_ = 0;
      local_6ef8[0] = 0;
      local_6ef8[2] = 0;
      local_6ef8[3] = 0;
      local_70a8[0x38] = 0;
      local_70a8._40_8_ = 0;
      local_70a8._48_8_ = 0;
      local_70a8._24_8_ = 0;
      local_70a8._32_8_ = 0;
      local_70a8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_70a8._16_8_ = 0;
      local_7038 = 0;
      local_7068._32_8_ = 0;
      local_7068._40_8_ = 0;
      local_7068._16_8_ = 0;
      local_7068._24_8_ = 0;
      local_7068.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_7068._8_8_ = 0;
      local_7000 = 0;
      local_7020._16_8_ = 0;
      local_7020._24_8_ = 0;
      local_7020.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_7020._8_8_ = 0;
      local_6ff8[0x20] = 0;
      local_6ff8._16_8_ = 0;
      local_6ff8._24_8_ = 0;
      local_6ff8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6ff8._8_8_ = 0;
      local_6fb0 = 0;
      local_6fd0._16_8_ = 0;
      local_6fd0._24_8_ = 0;
      local_6fd0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6fd0._8_8_ = 0;
      local_6fa8[0x30] = 0;
      local_6fa8._32_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6fa8._40_8_ = 0;
      local_6fa8._16_8_ = 0;
      local_6fa8._24_8_ = 0;
      local_6fa8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6fa8._8_8_ = 0;
      local_6f50 = 0;
      local_6f70._16_8_ = 0;
      local_6f70._24_8_ = 0;
      local_6f70.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6f70._8_8_ = 0;
      local_6f28 = 0;
      local_6f48._16_8_ = 0;
      local_6f48._24_8_ = 0;
      local_6f48.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6f48._8_8_ = 0;
      local_6ef8._16_8_ = local_6ef8;
      local_6ef8[0x10]._0_1_ = 0;
      local_6ef8[0xc] = 0;
      local_6ef8[0xd] = 0;
      local_6ef8[0xe] = 0;
      local_6ef8[0xf] = 0;
      local_6ef8[8] = 0;
      local_6ef8[9] = 0;
      local_6ef8[10] = 0;
      local_6ef8[0xb] = 0;
      local_6ef8[0x16]._0_1_ = 0;
      local_6ef8._89_8_ = 0;
      local_6ef8[0x12] = 0;
      local_6ef8[0x13] = 0;
      local_6ef8[0x14]._0_1_ = 0;
      local_6ef8._81_7_ = 0;
      local_6e50 = 0;
      local_6e90._48_8_ = 0;
      local_6e90._56_8_ = 0;
      local_6e90._32_8_ = 0;
      local_6e90._40_8_ = 0;
      local_6e90._16_8_ = 0;
      local_6e90._24_8_ = 0;
      local_6e90.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6e90._8_8_ = 0;
      local_6e48 = 0;
      local_6e44 = 0;
      local_6e40 = 0;
      local_6e3c = 0;
      local_6e38 = 0;
      local_6e30 = 0;
      local_6db8 = 0;
      local_6db0 = 0;
      local_6cd0._56_8_ = 0;
      local_6cd0._64_8_ = 0;
      local_6cd0._40_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6cd0._48_8_ = 0;
      local_6c80[0] = _S_red;
      local_6c78._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6df8 = 0;
      local_6e28._32_8_ = 0;
      local_6e28._40_8_ = 0;
      local_6e28._16_8_ = 0;
      local_6e28._24_8_ = 0;
      local_6e28.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6e28._8_8_ = 0;
      local_6dc0 = 0;
      local_6df0._32_8_ = 0;
      local_6df0._40_8_ = 0;
      local_6df0._16_8_ = 0;
      local_6df0._24_8_ = 0;
      local_6df0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6df0._8_8_ = 0;
      local_6d88 = 0;
      local_6da8._16_8_ = 0;
      local_6da8._24_8_ = 0;
      local_6da8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6da8._8_8_ = 0;
      local_6d60 = 0;
      local_6d80._16_8_ = 0;
      local_6d80._24_8_ = 0;
      local_6d80.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6d80._8_8_ = 0;
      local_6d38 = 0;
      local_6d58._16_8_ = 0;
      local_6d58._24_8_ = 0;
      local_6d58.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6d58._8_8_ = 0;
      local_6d00 = 0;
      local_6d30._32_8_ = 0;
      local_6d30._40_8_ = 0;
      local_6d30._16_8_ = 0;
      local_6d30._24_8_ = 0;
      local_6d30.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6d30._8_8_ = 0;
      local_6cd8 = 0;
      local_6cf8._16_8_ = 0;
      local_6cf8._24_8_ = 0;
      local_6cf8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6cf8._8_8_ = 0;
      local_6cd0[0x20] = 0;
      local_6cd0._16_8_ = 0;
      local_6cd0._24_8_ = 0;
      local_6cd0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6cd0._8_8_ = 0;
      local_6c78._8_8_ = local_6c80;
      local_6c78[0x38] = 0;
      local_6c78._40_8_ = 0;
      local_6c78._48_8_ = 0;
      local_6c78._24_8_ = 0;
      local_6c78._32_8_ = 0;
      local_6c78[0x50] = 0;
      local_6c78._81_8_ = 0;
      local_6c78._64_8_ = 0;
      local_6c78[0x48] = 0;
      local_6c78._73_7_ = 0;
      local_6c78[0x70] = 0;
      local_6c78._113_8_ = 0;
      local_6c78._96_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6c78[0x68] = 0;
      local_6c78._105_7_ = 0;
      local_6c78[0x80] = 0;
      local_6c78._132_4_ = 0;
      local_6c78[0x88] = 0;
      local_6c78._140_4_ = 0;
      local_6c78._144_2_ = 0;
      local_6c78[0x98] = 0;
      local_6b68 = 0;
      local_6b60 = 0;
      local_6a58._16_8_ = 0;
      local_6a58._24_8_ = 0;
      local_6a58.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6a58._8_8_ = 0;
      local_6a30[0] = 0;
      local_6a30[2] = 0;
      local_6a30[3] = 0;
      local_6ba8 = 0;
      local_6bd8._32_8_ = 0;
      local_6bd8._40_8_ = 0;
      local_6bd8._16_8_ = 0;
      local_6bd8._24_8_ = 0;
      local_6bd8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6bd8._8_8_ = 0;
      local_6b70 = 0;
      local_6ba0._32_8_ = 0;
      local_6ba0._40_8_ = 0;
      local_6ba0._16_8_ = 0;
      local_6ba0._24_8_ = 0;
      local_6ba0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6ba0._8_8_ = 0;
      local_6b38 = 0;
      local_6b58._16_8_ = 0;
      local_6b58._24_8_ = 0;
      local_6b58.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6b58._8_8_ = 0;
      local_6b10 = 0;
      local_6b30._16_8_ = 0;
      local_6b30._24_8_ = 0;
      local_6b30.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6b30._8_8_ = 0;
      local_6ae8 = 0;
      local_6b08._16_8_ = 0;
      local_6b08._24_8_ = 0;
      local_6b08.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6b08._8_8_ = 0;
      local_6ab0 = 0;
      local_6ae0._32_8_ = 0;
      local_6ae0._40_8_ = 0;
      local_6ae0._16_8_ = 0;
      local_6ae0._24_8_ = 0;
      local_6ae0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6ae0._8_8_ = 0;
      local_6a88 = 0;
      local_6aa8._16_8_ = 0;
      local_6aa8._24_8_ = 0;
      local_6aa8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6aa8._8_8_ = 0;
      local_6a60 = 0;
      local_6a80._16_8_ = 0;
      local_6a80._24_8_ = 0;
      local_6a80.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6a80._8_8_ = 0;
      local_6a30._16_8_ = local_6a30;
      local_6a30[0x10]._0_1_ = 0;
      local_6a30[0xc] = 0;
      local_6a30[0xd] = 0;
      local_6a30[0xe] = 0;
      local_6a30[0xf] = 0;
      local_6a30[8] = 0;
      local_6a30[9] = 0;
      local_6a30[10] = 0;
      local_6a30[0xb] = 0;
      local_6a30[0x16]._0_1_ = 0;
      local_6a30._89_8_ = 0;
      local_6a30[0x12] = 0;
      local_6a30[0x13] = 0;
      local_6a30[0x14]._0_1_ = 0;
      local_6a30._81_7_ = 0;
      local_6988 = 0;
      local_69c8._48_8_ = 0;
      local_69c8._56_8_ = 0;
      local_69c8._32_8_ = 0;
      local_69c8._40_8_ = 0;
      local_69c8._16_8_ = 0;
      local_69c8._24_8_ = 0;
      local_69c8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_69c8._8_8_ = 0;
      local_6980 = 0;
      local_697c = 0;
      local_6978 = 0;
      local_6974 = 0;
      local_6970.has_value_ = false;
      local_6970.contained = (storage_t<bool>)0x0;
      local_6968[0] = false;
      auStack_6900._16_8_ = (storage_t<double>)0x0;
      auStack_6900[0x18] = false;
      local_67e0._16_8_ = 0;
      local_67e0._24_8_ = 0;
      local_67e0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_67e0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_67b8._0_4_ = _S_red;
      local_67b8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6930[0]._0_1_ = false;
      local_6960._32_8_ = 0;
      local_6960._40_8_ = 0;
      local_6960._16_8_ = (_Base_ptr)0x0;
      local_6960._24_8_ = 0;
      local_6960._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6960._8_8_ = (_Base_ptr)0x0;
      auStack_6900[8] = false;
      local_6928._32_8_ = (pointer)0x0;
      auStack_6900._0_8_ = (pointer)0x0;
      local_6928._16_8_ = 0;
      local_6928._24_8_ = (pointer)0x0;
      local_6928._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6928._8_8_ = (_Base_ptr)0x0;
      auStack_68c8[8] = false;
      auStack_6900._48_8_ = 0;
      auStack_68c8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_6900._32_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_6900._40_8_ = (_Base_ptr)0x0;
      local_6898 = false;
      auStack_68c8._32_8_ = 0;
      auStack_68c8._40_8_ = 0;
      auStack_68c8._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_68c8._24_8_ = 0;
      local_6890[0x20] = false;
      local_6890._16_8_ = 0;
      local_6890[0x18] = false;
      local_6890._25_3_ = 0;
      local_6890._28_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
      local_6890._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6890._8_8_ = 0;
      local_6868[0x30] = 0;
      local_6868._32_8_ = 0;
      local_6868._40_8_ = 0;
      local_6868._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6868._24_8_ = 0;
      local_6868._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6868._8_8_ = 0;
      local_6830[0x20] = 0;
      local_6830._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6830._24_8_ = 0;
      local_6830._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6830._8_8_ = 0;
      local_67e8._0_1_ = 0;
      local_6808._16_8_ = 0;
      local_6808._24_8_ = 0;
      local_6808._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6808._8_8_ = 0;
      local_67b8._16_8_ = local_67b8;
      local_6788[0x10] = 0;
      local_6788._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6788._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_67b8._32_8_ = 0;
      local_67b8._40_8_ = (pointer)0x0;
      auStack_6760[0] = 0;
      auStack_6760._1_8_ = 0;
      local_6788._24_8_ = 0;
      local_6788[0x20] = false;
      local_6788._33_7_ = 0;
      local_6730[0x20] = 0;
      local_6730._16_8_ = 0;
      local_6730._24_8_ = 0;
      local_6730._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6730._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_6760._32_8_ = 0;
      auStack_6760._40_8_ = 0;
      auStack_6760._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_6760._24_8_ = 0;
      local_6708[0] = false;
      local_6708._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
      local_6708[8] = 0;
      local_6708._12_4_ = 0;
      local_6708._16_2_ = 0;
      local_6708[0x18] = 0;
      local_6680._8_8_ = (storage_t<double>)0x0;
      local_6680[0x10] = false;
      local_6558.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6558._8_8_ = 0;
      local_6568._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6568._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6540[0] = _S_red;
      local_6538._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_66b8 = false;
      local_66d8._16_8_ = 0;
      local_66d8._24_8_ = 0;
      local_66d8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_66d8._8_8_ = 0;
      local_66e8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_66e8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6680[0] = false;
      local_66b0._32_8_ = 0;
      local_66b0._40_8_ = (pointer)0x0;
      local_66b0._16_8_ = (_Base_ptr)0x0;
      local_66b0._24_8_ = (_Base_ptr)0x0;
      local_66b0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_66b0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6658[0x10] = 0;
      local_6658._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6658._8_8_ = 0;
      local_6680._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6680._32_8_ = (pointer)0x0;
      local_6620 = 0;
      local_6640._16_8_ = 0;
      local_6640._24_8_ = 0;
      local_6640.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6640._8_8_ = 0;
      local_65f8 = false;
      local_6618._16_8_ = 0;
      local_6618._24_1_ = false;
      local_6618._25_3_ = 0;
      local_6618._28_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
      local_6618.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6618._8_8_ = 0;
      local_65f0[0x30] = 0;
      local_65f0._32_8_ = 0;
      local_65f0._40_8_ = 0;
      local_65f0._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_65f0._24_8_ = 0;
      local_65f0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_65f0._8_8_ = 0;
      auStack_65a0[8] = 0;
      local_65b8._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_65a0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_65b8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_65b8._8_8_ = 0;
      auStack_6578[8] = 0;
      auStack_65a0._32_8_ = 0;
      auStack_6578._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_65a0._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_65a0._24_8_ = 0;
      local_6538._8_8_ = local_6540;
      local_6510._16_1_ = 0;
      local_6510.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6510._8_8_ = 0;
      local_6538._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6538._32_8_ = (pointer)0x0;
      auStack_64e8[0] = 0;
      auStack_64e8._1_8_ = 0;
      local_6510._24_8_ = 0;
      bStack_64f0 = false;
      local_64ef = 0;
      auStack_64b0[0x18] = 0;
      auStack_64b0._8_8_ = 0;
      auStack_64b0._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_64e8._48_8_ = 0;
      auStack_64b0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_64e8._32_8_ = 0;
      auStack_64e8._40_8_ = 0;
      auStack_64e8._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_64e8._24_8_ = 0;
      auStack_64b0._32_4_ = ResetToExplicit;
      auStack_6460._8_8_ = 0;
      auStack_6488._32_8_ = (pointer)0x0;
      auStack_6460._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_6460._24_4_ = 0;
      auStack_6460._32_8_ = (_Base_ptr)0x0;
      auStack_6488._16_4_ = 0;
      auStack_6488._20_8_ = 0;
      auStack_6488._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_6488._8_4_ = 0;
      auStack_6488._12_4_ = 0;
      auStack_6460._40_8_ = auStack_6460 + 0x18;
      local_6428._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6428._16_4_ = _S_red;
      local_6428._24_8_ = (pointer)0x0;
      local_6428._32_8_ = local_6428 + 0x10;
      oStack_63f8.contained._8_4_ = (storage_t<tinyusdz::Kind>)0x0;
      oStack_63f8.contained._0_1_ = false;
      oStack_63f8.contained._1_1_ = (storage_t<bool>)0x0;
      oStack_63f8.contained._2_1_ = false;
      oStack_63f8.contained._3_1_ = (storage_t<bool>)0x0;
      oStack_63f8.contained._4_1_ = false;
      oStack_63f8.has_value_ = false;
      oStack_63f8._1_4_ = 0;
      oStack_63f8._5_3_ = 0;
      oStack_63f8.contained._16_8_ = &local_63d0;
      oStack_63f8.contained._24_1_ = false;
      oStack_63f8.contained._25_3_ = 0;
      oStack_63f8.contained._28_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
      local_63d0._M_local_buf[0] = false;
      local_63c0 = false;
      auStack_6288[0x10] = 0;
      local_6110._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6110._24_8_ = 0;
      local_6110._0_8_ = (storage_t<double>)0x0;
      local_6110._8_8_ = 0;
      local_60e8._0_4_ = 0;
      local_60e0 = (_Base_ptr)0x0;
      local_63b8[0x30] = false;
      local_63b8._32_8_ = 0;
      local_63b8._40_8_ = 0;
      local_63b8._16_8_ = 0;
      local_63b8._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_63b8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_63b8._8_8_ = 0;
      local_6350 = false;
      local_6380._32_8_ = 0;
      local_6380._40_8_ = 0;
      local_6380._16_8_ = 0;
      local_6380._24_8_ = 0;
      local_6380.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6380._8_8_ = 0;
      local_6318[0] = false;
      local_6348._32_8_ = 0;
      local_6348._40_8_ = 0;
      local_6348._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6348._24_8_ = 0;
      local_6348._0_8_ = (storage_t<double>)0x0;
      local_6348._8_8_ = 0;
      auStack_62e8[8] = 0;
      local_6318._40_8_ = 0;
      auStack_62e8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6318._24_8_ = 0;
      local_6318._32_8_ = 0;
      local_6318._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6318._16_8_ = 0;
      auStack_62c0[8] = 0;
      auStack_62e8._32_8_ = 0;
      auStack_62c0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_62e8._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_62e8._24_8_ = 0;
      auStack_6288._8_2_ = 0;
      auStack_62c0._48_8_ = 0;
      auStack_6288._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_62c0._32_8_ = 0;
      auStack_62c0._40_8_ = 0;
      auStack_62c0._16_8_ = 0;
      auStack_62c0._24_8_ = 0;
      local_6240 = false;
      local_6260._16_8_ = 0;
      local_6260._24_8_ = 0;
      local_6260.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6260._8_8_ = 0;
      auStack_6288._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_6288._32_8_ = 0;
      local_6218 = false;
      local_6238._16_8_ = 0;
      local_6238._24_8_ = 0;
      local_6238.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6238._8_8_ = 0;
      local_61f0 = false;
      local_6210._16_8_ = (_Base_ptr)0x0;
      local_6210._24_8_ = (_Base_ptr)0x0;
      local_6210.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6210._8_8_ = (_Base_ptr)0x0;
      local_61c8 = false;
      local_61e8._16_8_ = (pointer)0x0;
      local_61e8._24_8_ = (pointer)0x0;
      local_61e8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_61e8._8_8_ = (pointer)0x0;
      local_61a0 = false;
      local_61c0._16_1_ = false;
      local_61c0._17_3_ = 0;
      local_61c0._20_4_ = RightHanded;
      local_61c0._24_8_ = 0;
      local_61c0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_61c0._8_1_ = false;
      local_61c0._9_3_ = 0;
      local_61c0._12_4_ = (storage_t<tinyusdz::Orientation>)0x0;
      local_6198[0x30] = 0;
      local_6198._32_8_ = 0;
      local_6198._40_8_ = 0;
      local_6198._16_8_ = 0;
      local_6198._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6198[0] = false;
      local_6198._1_3_ = 0;
      local_6198._4_4_ = (storage_t<unsigned_int>)0x0;
      local_6198._8_8_ = 0;
      local_6160[0x20] = 0;
      local_6160._16_8_ = 0;
      local_6160._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6160._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6160._8_8_ = 0;
      local_6118 = false;
      local_6138._16_8_ = 0;
      local_6138._24_8_ = 0;
      local_6138.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6138._8_8_ = 0;
      local_60d8.data._0_8_ = (undefined8)local_60e8;
      local_60d8._16_8_ = 0;
      local_60b8[0] = _S_red;
      local_60b0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_60b0._8_8_ = local_60b8;
      local_6088._32_1_ = 0;
      local_6088._33_8_ = 0;
      local_6088._16_8_ = 0;
      local_6088._24_1_ = 0;
      local_6088._25_7_ = 0;
      local_6088.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_6088._8_8_ = 0;
      local_60b0._24_8_ = 0;
      pTStack_6090 = (pointer)0x0;
      local_6058[0x20] = 0;
      local_6058._16_8_ = 0;
      local_6058._24_8_ = 0;
      local_6058._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6058._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_6030[0x10] = 0;
      auStack_6030._17_8_ = 0;
      auStack_6030._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_6030[8] = 0;
      auStack_6030._9_7_ = 0;
      local_5fd0 = (_Base_ptr)0x0;
      local_5fe0 = (pointer)0x0;
      pTStack_5fd8 = (pointer)0x0;
      local_6010._32_8_ = 0;
      local_6010._40_8_ = 0;
      local_6010._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6010._24_8_ = 0;
      local_6010._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_6010._8_8_ = 0;
      local_7130[0]._0_8_ = local_7148._16_8_;
      local_6ef8._24_8_ = local_6ef8._16_8_;
      local_6c78._16_8_ = local_6c78._8_8_;
      local_6a30._24_8_ = local_6a30._16_8_;
      local_67b8._24_8_ = local_67b8._16_8_;
      local_6538._16_8_ = local_6538._8_8_;
      local_6430 = (_Base_ptr)auStack_6460._40_8_;
      local_6428._40_8_ = local_6428._32_8_;
      local_60d8._8_8_ = local_60d8.data.__align;
      local_60b0._16_8_ = local_60b0._8_8_;
      bVar12 = detail::ExportSkelAnimation
                         ((Animation *)
                          ((long)&(((scene->animations).
                                    super__Vector_base<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->prim_name).
                                  _M_dataplus._M_p + lVar29),(SkelAnimation *)local_7340,
                          (string *)local_99b8._M_dataplus._M_p);
      if (!bVar12) {
        SkelAnimation::~SkelAnimation((SkelAnimation *)local_7340);
        Prim::~Prim((Prim *)local_97e0);
        this_02 = (Scope *)local_8f78;
        goto LAB_0031c430;
      }
      Prim::Prim<tinyusdz::SkelAnimation>((Prim *)local_92c8,(SkelAnimation *)local_7340);
      Prim::add_child((Prim *)local_97e0,(Prim *)local_92c8,true,(string *)0x0);
      Prim::~Prim((Prim *)local_92c8);
      scene = local_99c0;
      SkelAnimation::~SkelAnimation((SkelAnimation *)local_7340);
      uVar22 = uVar22 + 1;
      lVar29 = lVar29 + 0xc0;
    } while (uVar22 < (ulong)(((long)(scene->animations).
                                     super__Vector_base<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(scene->animations).
                                     super__Vector_base<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 6) *
                             -0x5555555555555555));
  }
  Stage::add_root_prim((Stage *)local_2678,(Prim *)local_97e0,true);
  Prim::~Prim((Prim *)local_97e0);
  Scope::~Scope((Scope *)local_8f78);
  Scope::Scope((Scope *)local_7340);
  ::std::__cxx11::string::_M_replace((ulong)local_6968,0,(char *)local_6960._0_8_,0x5e0269);
  Prim::Prim<tinyusdz::Scope>((Prim *)local_97e0,(Scope *)local_7340);
  if ((scene->materials).
      super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (scene->materials).
      super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_99b8.field_2._M_allocated_capacity = (size_type)local_99b8._M_dataplus._M_p;
    sVar25 = 0;
    do {
      local_8f78._0_8_ = (pointer)0x0;
      local_8f78._8_8_ = (pointer)0x0;
      local_8f68._0_8_ = 0;
      local_8f58._0_4_ = Def;
      local_8f50._M_p = (pointer)0x0;
      local_8f48._16_8_ = 0;
      local_8f30._M_p = local_8f30._M_p & 0xffffffffffffff00;
      local_8f48._0_8_ = local_8f58;
      local_8f48._8_8_ = local_8f58;
      memset(local_8908,0,0x308);
      _Stack_85f8._0_8_ = _Stack_85f8._0_8_ & 0xffffffff00000000;
      _Stack_85f8._M_parent = (_Base_ptr)0x0;
      memset(local_8f28,0,0x309);
      memset(auStack_8c18,0,0x309);
      _Stack_85f8._M_left = &_Stack_85f8;
      local_85d8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_85d8._16_8_ = local_85d8._16_8_ & 0xffffffff00000000;
      local_85d8._24_8_ = 0;
      local_85b8 = (anon_struct_8_0_00000001_for___align)((long)&local_85d8 + 0x10);
      local_85b0._8_8_ = 0;
      local_85a0[0] = local_8590;
      local_85a0[1] = (char *)0x0;
      local_8590[0] = false;
      local_8590._16_8_ = auStack_8570;
      local_8590._24_8_ = 0;
      auStack_8570._0_8_ = auStack_8570._0_8_ & 0xffffffffffffff00;
      local_8560._0_8_ = local_8560._0_8_ & 0xffffffff00000000;
      local_8560._8_8_ = 0xffffffffffffffff;
      local_8560._24_8_ = local_8560._24_8_ & 0xffffffff00000000;
      local_8560._16_8_ = local_8560._16_8_ & 0xffffff0000000000;
      local_8560._32_8_ = auStack_8538 + 8;
      auStack_8538._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_8538[8] = false;
      local_8528._8_8_ = local_8528._8_8_ & 0xffffffffffffff00;
      local_83d8._0_8_ = local_83d8._0_8_ & 0xffffffffffffff00;
      local_8270._16_8_ = (_Base_ptr)0x0;
      local_8270._24_8_ = (_Base_ptr)0x0;
      local_8270._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_8270._8_8_ = 0;
      local_8248._M_color = 0;
      local_8248._M_parent = (_Base_ptr)0x0;
      auStack_8500[0x18] = 0;
      auStack_8500._8_8_ = 0;
      auStack_8500._16_8_ = 0;
      local_8528._32_8_ = 0;
      auStack_8500._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_8528._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_8528._24_8_ = 0;
      local_84c8._24_4_ = local_84c8._24_4_ & 0xffffff00;
      local_84c8._8_8_ = 0;
      local_84c8._16_8_ = 0;
      local_84e0._16_8_ = 0;
      local_84c8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_84e0._0_8_ = 0;
      local_84e0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_8480._8_8_ = auStack_8480._8_8_ & 0xffffffffffffff00;
      local_84a8._32_8_ = 0;
      auStack_8480._0_8_ = 0;
      local_84a8._16_8_ = (_Base_ptr)0x0;
      local_84a8._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_84a8._0_8_ = (_Base_ptr)0x0;
      local_84a8._8_8_ = (_Base_ptr)0x0;
      sStack_8458._24_8_ = sStack_8458._24_8_ & 0xffffffffffffff00;
      sStack_8458._8_8_ = (pointer)0x0;
      sStack_8458._16_8_ = (pointer)0x0;
      auStack_8480._32_8_ = 0;
      sStack_8458.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_8480._16_8_ = (_Base_ptr)0x0;
      auStack_8480._24_8_ = (_Base_ptr)0x0;
      local_8420._8_8_ = local_8420._8_8_ & 0xffffffffffffff00;
      auStack_8438[0x10] = false;
      auStack_8438._17_7_ = 0;
      local_8420._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_8438[0] = false;
      auStack_8438._1_7_ = 0;
      auStack_8438[8] = 0;
      auStack_8438._9_7_ = 0;
      auStack_83f8[8] = 0;
      auStack_83f8._9_7_ = 0;
      auStack_83f8[0x10] = 0;
      auStack_83f8._17_7_ = 0;
      local_8420._32_8_ = 0;
      auStack_83f8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_8420._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_8420._24_8_ = 0;
      auStack_83f8[0x18] = false;
      auStack_83f8[0x19] = 0;
      local_83b8._24_8_ = local_83b8._24_8_ & 0xffffffffffffff00;
      local_83b8._8_8_ = (pointer)0x0;
      local_83b8._16_8_ = (pointer)0x0;
      local_83d8._24_8_ = (pointer)0x0;
      local_83b8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_83d8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_83d8._16_8_ = 0;
      local_8398[0x20] = 0;
      local_8398._16_8_ = 0;
      local_8398._24_8_ = 0;
      local_8398._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_8398._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_8370[0x20] = 0;
      local_8370._16_8_ = 0;
      local_8370._24_8_ = 0;
      local_8370._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_8370._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_8348[0x20] = 0;
      local_8348._16_8_ = 0;
      local_8348._24_8_ = 0;
      local_8348._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_8348._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_8320[0x20] = 0;
      local_8320._16_8_ = 0;
      local_8320._24_8_ = 0;
      local_8320._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_8320._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_82f8[0x30] = 0;
      local_82f8._32_8_ = 0;
      local_82f8._40_8_ = 0;
      local_82f8._16_8_ = 0;
      local_82f8._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_82f8._0_8_ = 0;
      local_82f8._8_8_ = 0;
      local_82c0[0x20] = 0;
      local_82c0._16_8_ = 0;
      local_82c0._24_8_ = 0;
      local_82c0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_82c0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_8298[0x20] = 0;
      local_8298._16_8_ = 0;
      local_8298._24_8_ = 0;
      local_8298._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_8298._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_8248._M_left = &local_8248;
      local_8228 = (_Base_ptr)0x0;
      local_8218[0].str_._M_dataplus._M_p._0_4_ = 0;
      local_8218[0].str_._M_string_length = 0;
      local_8218[0].str_.field_2._0_8_ = local_8218;
      sStack_81d8._16_1_ = 0;
      sStack_81d8._17_8_ = 0;
      sStack_81d8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      sStack_81d8._8_1_ = 0;
      sStack_81d8._9_7_ = 0;
      local_8218[1].str_.field_2._0_8_ = (pointer)0x0;
      local_8218[1].str_.field_2._8_8_ = 0;
      local_8218[1].str_._M_dataplus._M_p = (pointer)0x0;
      local_8218[1].str_._M_string_length = 0;
      local_81b8[0x20] = false;
      local_81b8._16_8_ = 0;
      local_81b8._24_8_ = 0;
      local_81b8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_81b8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      sStack_8190._16_1_ = 0;
      stack0xffffffffffff7e81 = 0;
      sStack_8190.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      sStack_8190._8_1_ = 0;
      sStack_8190._9_7_ = 0;
      local_8120.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      asStack_8170[2]._16_8_ = 0;
      uStack_8128 = 0;
      local_8120._16_4_ = 0;
      local_8120._24_8_ = 0;
      asStack_8170[0]._16_4_ = 0;
      asStack_8170._20_8_ = 0;
      asStack_8170[0].data.__align = (optional<unsigned_int>)0x0;
      asStack_8170[0]._8_4_ = 0;
      asStack_8170[0]._12_4_ = 0;
      asStack_8170[2]._0_4_ = 0;
      asStack_8170[2]._4_8_ = 0;
      asStack_8170[1]._8_8_ = 0;
      asStack_8170[1]._16_4_ = 0;
      asStack_8170[1]._20_4_ = 0;
      local_8120._32_8_ = (long)&local_8120 + 0x10;
      asStack_80d8[0]._24_8_ = 0;
      asStack_80d8[0]._8_8_ = 0;
      asStack_80d8[0]._16_8_ = 0;
      local_80e0 = 0;
      asStack_80d8[0].data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_80f0 = 0;
      uStack_80e8 = (storage_t<double>)0x0;
      _Stack_85f8._M_right = _Stack_85f8._M_left;
      local_85b0._0_8_ = local_85b8;
      local_8248._M_right = local_8248._M_left;
      local_8218[0].str_.field_2._8_8_ = local_8218[0].str_.field_2._0_8_;
      local_8120._40_8_ = local_8120._32_8_;
      Prim::Prim<tinyusdz::Model>((Prim *)local_92c8,(Model *)local_8f78);
      local_9478[0]._M_dataplus._M_p = (pointer)&local_9478[0].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_9478,"/materials","");
      bVar12 = detail::ToMaterialPrim
                         (scene,local_9478,sVar25,(Prim *)local_92c8,
                          (string *)local_99b8.field_2._M_allocated_capacity);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9478[0]._M_dataplus._M_p != &local_9478[0].field_2) {
        operator_delete(local_9478[0]._M_dataplus._M_p,
                        local_9478[0].field_2._M_allocated_capacity + 1);
      }
      if (!bVar12) {
LAB_0031c401:
        Prim::~Prim((Prim *)local_92c8);
        Model::~Model((Model *)local_8f78);
        Prim::~Prim((Prim *)local_97e0);
        this_02 = (Scope *)local_7340;
LAB_0031c430:
        Scope::~Scope(this_02);
LAB_0031c435:
        bVar12 = false;
        goto LAB_0031c437;
      }
      uVar24 = local_99b8.field_2._M_allocated_capacity;
      bVar12 = Prim::add_child((Prim *)local_97e0,(Prim *)local_92c8,false,
                               (string *)local_99b8.field_2._M_allocated_capacity);
      if (!bVar12) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_9478);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_9478,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_9478,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                   ,0x5a);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_9478,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_9478,"export_to_usda",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_9478,"():",3);
        poVar21 = (ostream *)::std::ostream::operator<<(local_9478,0x5ab);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar21," ",1);
        pBVar2 = (pointer)(local_9998 + 0x10);
        local_9998._0_8_ = pBVar2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_9998,"Failed to add child Prim: {}","");
        fmt::format<std::__cxx11::string*>
                  ((string *)local_99e0,(fmt *)local_9998,&local_99b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)uVar24);
        poVar21 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_9478,(char *)local_99e0,local_99d8._0_8_);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\n",1);
        puVar26 = (ulong *)(local_99d8 + 8);
        if (local_99e0 != (undefined1  [8])puVar26) {
          operator_delete((void *)local_99e0,local_99d8._8_8_ + 1);
        }
        if ((pointer)local_9998._0_8_ != pBVar2) {
          operator_delete((void *)local_9998._0_8_,
                          (ulong)((long)&(((string *)local_9998._16_8_)->_M_dataplus)._M_p + 1));
        }
        if ((AttrMetas *)local_99b8._M_dataplus._M_p != (AttrMetas *)0x0) {
          ::std::__cxx11::stringbuf::str();
          plVar17 = (long *)::std::__cxx11::string::append(local_9998);
          puVar23 = (ulong *)(plVar17 + 2);
          if ((ulong *)*plVar17 == puVar23) {
            local_99d8._8_8_ = *puVar23;
            local_99d8._16_8_ = plVar17[3];
            local_99e0 = (undefined1  [8])puVar26;
          }
          else {
            local_99d8._8_8_ = *puVar23;
            local_99e0 = (undefined1  [8])*plVar17;
          }
          local_99d8._0_8_ = plVar17[1];
          *plVar17 = (long)puVar23;
          plVar17[1] = 0;
          *(undefined1 *)(plVar17 + 2) = 0;
          ::std::__cxx11::string::_M_append(local_99b8._M_dataplus._M_p,(ulong)local_99e0);
          if (local_99e0 != (undefined1  [8])puVar26) {
            operator_delete((void *)local_99e0,local_99d8._8_8_ + 1);
          }
          if ((pointer)local_9998._0_8_ != pBVar2) {
            operator_delete((void *)local_9998._0_8_,
                            (ulong)((long)&(((string *)local_9998._16_8_)->_M_dataplus)._M_p + 1));
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_9478);
        ::std::ios_base::~ios_base(local_9408);
        goto LAB_0031c401;
      }
      Prim::~Prim((Prim *)local_92c8);
      Model::~Model((Model *)local_8f78);
      sVar25 = sVar25 + 1;
      scene = local_99c0;
    } while (sVar25 < (ulong)((long)(local_99c0->materials).
                                    super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_99c0->materials).
                                    super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 8));
  }
  Stage::add_root_prim((Stage *)local_2678,(Prim *)local_97e0,true);
  Prim::~Prim((Prim *)local_97e0);
  Scope::~Scope((Scope *)local_7340);
  Stage::ExportToString_abi_cxx11_((string *)local_7340,(Stage *)local_2678,false);
  ::std::__cxx11::string::operator=((string *)local_97f0,(string *)local_7340);
  if ((pointer)local_7340._0_8_ != (pointer)local_7330) {
    operator_delete((void *)local_7340._0_8_,CONCAT71(local_7330._1_7_,local_7330[0]) + 1);
  }
  bVar12 = true;
LAB_0031c437:
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::Skeleton>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_9300);
  Prim::~Prim(&local_29c8);
  SkelRoot::~SkelRoot((SkelRoot *)local_1010);
  Stage::~Stage((Stage *)local_2678);
  return bVar12;
LAB_00319d63:
  bVar12 = false;
LAB_0031ad5f:
  scene = local_99c0;
  Prim::~Prim((Prim *)local_97e0);
  ::std::vector<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_>::~vector
            ((vector<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_> *)local_9998);
LAB_0031ad71:
  ::std::vector<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>::~vector(&local_9888);
  GeomMesh::~GeomMesh((GeomMesh *)local_7340);
  if (!bVar12) goto LAB_0031c435;
  uVar22 = local_99b8._M_string_length + 1;
  if ((ulong)(((long)(scene->meshes).
                     super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(scene->meshes).
                     super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x7063e7063e7063e7) <=
      uVar22) goto code_r0x0031adc0;
  goto LAB_00318976;
code_r0x0031adc0:
  if ((local_9938._40_8_ & 1) != 0) {
    if (local_9300._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      _Var33._M_nxt = local_9300._M_before_begin._M_nxt;
      do {
        Prim::Prim<tinyusdz::Skeleton>((Prim *)local_7340,(Skeleton *)(_Var33._M_nxt + 2));
        Prim::add_child(&local_29c8,(Prim *)local_7340,false,(string *)0x0);
        Prim::~Prim((Prim *)local_7340);
        _Var33._M_nxt = (_Var33._M_nxt)->_M_nxt;
      } while (_Var33._M_nxt != (_Hash_node_base *)0x0);
    }
    Stage::add_root_prim((Stage *)local_2678,&local_29c8,true);
  }
  goto LAB_0031ae2c;
}

Assistant:

bool export_to_usda(const RenderScene &scene,
  std::string &usda_str, std::string *warn, std::string *err) {

  (void)warn;

  Stage stage;

  stage.metas().comment = "Exported from TinyUSDZ Tydra.";
  if (scene.meta.upAxis == "X") {
    stage.metas().upAxis = Axis::X;
  } else if (scene.meta.upAxis == "Y") {
    stage.metas().upAxis = Axis::Y;
  } else if (scene.meta.upAxis == "Z") {
    stage.metas().upAxis = Axis::Z;
  }

  SkelRoot skelRoot;
  skelRoot.set_name("skelRoot"); 
  Prim skelRootPrim(skelRoot);

  bool has_skelroot{false};

  // TODO: Construct Node hierarchy

  std::unordered_map<uint32_t, Skeleton> skelMap;

  for (size_t i = 0; i < scene.meshes.size(); i++) {
    GeomMesh mesh;
    std::vector<GeomSubset> subsets;
    if (!detail::ToGeomMesh(scene, scene.meshes[i], &mesh, &subsets, err)) {
      return false;
    }

    bool has_skel{false};

    if ((scene.meshes[i].skel_id > -1) && (size_t(scene.meshes[i].skel_id) < scene.skeletons.size())) {
      DCOUT("Export Skeleton");

      uint32_t skel_id = uint32_t(scene.meshes[i].skel_id);
      std::string skel_name;
      if (!skelMap.count(skel_id)) {
        const SkelHierarchy &src_skel = scene.skeletons[size_t(scene.meshes[i].skel_id)];

        std::string src_animsource; // empty = no animationSource
        if (src_skel.anim_id > -1) {
          src_animsource = "/animations/" + scene.animations[size_t(src_skel.anim_id)].prim_name;
        }

        Skeleton skel;
        if (!detail::ExportSkeleton(src_skel, src_animsource, &skel, err)) {
          return false;
        }
        skel_name = skel.name;

        APISchemas skelAPISchema;
        skelAPISchema.listOpQual = ListEditQual::Prepend;
        skelAPISchema.names.push_back({APISchemas::APIName::SkelBindingAPI, ""});
        skel.metas().apiSchemas = skelAPISchema;

        skelMap[skel_id] = std::move(skel);
      } else {
        skel_name = skelMap[skel_id].name;
      }

      has_skel = true;
      has_skelroot = true;

      // Add some skel settings to GeomMesh.
      
      // rel skel:skeleton
      Relationship skelRel;
      // FIXME: Set abs_path 
      Path skelTargetPath("/skelRoot/" + skel_name, "");
      skelRel.set(skelTargetPath);
      mesh.skeleton = skelRel;

    
      // Add apiSchemas both for GeomMesh and Skeleton
      //
      // prepend apiSchemas = ["SkelBindingAPI"]
      //
      APISchemas skelAPISchema;
      skelAPISchema.listOpQual = ListEditQual::Prepend;
      skelAPISchema.names.push_back({APISchemas::APIName::SkelBindingAPI, ""});
      if (mesh.metas().apiSchemas) {
        // Assume existing apiSchemas uses prepend listEditOp.
        mesh.metas().apiSchemas.value().names.push_back({APISchemas::APIName::SkelBindingAPI, ""});
      } else {
        mesh.metas().apiSchemas = skelAPISchema;
      }

    }

    std::vector<BlendShape> bss;
    if (scene.meshes[i].targets.size()) {

      std::vector<value::token> bsNames;
      std::vector<Path> bsTargetPaths;

      for (const auto &target : scene.meshes[i].targets) {
        BlendShape bs;
        if (!detail::ExportBlendShape(target.second, &bs, err)) {
          return false;
        }

        bss.emplace_back(bs);
        bsNames.push_back(value::token(target.first));
        // TODO: Set abs_path
        std::string bs_path;
        if (has_skel) {
          bs_path = "/skelRoot/" + mesh.name + "/" + target.first;
        } else {
          bs_path = "/" + mesh.name + "/" + target.first;
        }
        Path targetPath = Path(bs_path, "");
        bsTargetPaths.push_back(targetPath);
      }

      Relationship bsTargetRel;
      bsTargetRel.set(bsTargetPaths);

      mesh.blendShapeTargets = bsTargetRel;
      mesh.blendShapes.set_value(bsNames);

    }

    Prim meshPrim(mesh);

    // Add BlendShape prim under GeomMesh prim.
    if (bss.size()) {
      for (size_t t = 0; t < bss.size(); t++) {
        Prim bsPrim(bss[t]);
        if (!meshPrim.add_child(std::move(bsPrim), /* rename_primname_if_requred */false, err)) {
          return false;
        }
      }
    }

    // Add GeomSubset prim under GeomMesh prim.
    if (subsets.size()) {
      for (size_t s = 0; s < subsets.size(); s++) {
        Prim subsetPrim(subsets[s]);
        if (!meshPrim.add_child(std::move(subsetPrim), /* rename_primname_if_required */false, err)) {
          return false;
        }
      }
    }

    if (has_skel) {

      skelRootPrim.add_child(std::move(meshPrim), /* rename_primname_if_require */false);

    } else {
      // Put Prims under Scope Prim
      Scope scope;
      scope.name = "scope" + std::to_string(i);

      Prim scopePrim(scope);
      scopePrim.add_child(std::move(meshPrim));

      stage.add_root_prim(std::move(scopePrim));
    }

  }

  if (has_skelroot) {

    for (const auto &item : skelMap) {
      Prim skelPrim(item.second);
      skelRootPrim.add_child(std::move(skelPrim), /* rename_primname_if_require */false);
    }

    stage.add_root_prim(std::move(skelRootPrim));
  }

  // TODO: Move to SkelRoot
  {
    Scope animGroup;
    animGroup.name = "animations";

    Prim animGroupPrim(animGroup);

    for (size_t i = 0; i < scene.animations.size(); i++) {
      SkelAnimation skelAnim;
      if (!detail::ExportSkelAnimation(scene.animations[i], &skelAnim, err)) {
        return false;
      }

      // TODO: Put SkelAnimation under SkelRoot
      Prim prim(skelAnim);
      animGroupPrim.add_child(std::move(prim));
    }
    stage.add_root_prim(std::move(animGroupPrim));
  }

  {
    Scope matGroup;
    matGroup.name = "materials";

    Prim matGroupPrim(matGroup);

    DCOUT("export " << scene.materials.size() << " materials");

    for (size_t i = 0; i < scene.materials.size(); i++) {
      // init with dummy object(Model Prim)
      Model dummy;
      Prim matPrim(std::move(dummy));  
      if (!detail::ToMaterialPrim(scene, "/materials", i, &matPrim, err)) {
        return false;
      }
      if (!matGroupPrim.add_child(std::move(matPrim), /* rename_primname_if_required */false, err)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Failed to add child Prim: {}", err));
      }
      
    }
    stage.add_root_prim(std::move(matGroupPrim));
  }

  usda_str =stage.ExportToString();

  return true;
}